

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_fma::forward
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  uint uVar14;
  _func_int *p_Var15;
  int *piVar16;
  long lVar17;
  void *pvVar18;
  float *pfVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [32];
  void *pvVar31;
  long lVar32;
  int iVar33;
  undefined1 (*pauVar34) [32];
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  uint uVar41;
  long lVar42;
  uint uVar43;
  long lVar44;
  long lVar45;
  uint uVar46;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar66;
  undefined1 auVar60 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar103;
  undefined1 auVar101 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [28];
  undefined1 auVar140 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar118 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar162;
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar198 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  v4sf one;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar241 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [64];
  float fVar306;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  float fVar326;
  float fVar328;
  float fVar329;
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar327;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [64];
  undefined1 auVar342 [16];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar347 [64];
  undefined1 auVar348 [16];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffe7c;
  uint local_160;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  undefined1 local_f8 [16];
  size_t local_e8;
  int local_e0;
  Allocator *local_d8;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  int local_c0;
  size_t local_b8;
  _func_int *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar63 [32];
  float fVar67;
  undefined1 auVar88 [32];
  float fVar102;
  undefined1 auVar139 [32];
  undefined1 auVar141 [32];
  
  auVar105 = in_ZMM12._0_16_;
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0xdc + (long)this->_vptr_InnerProduct_x86_fma[-3]) != 0)) {
    iVar27 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar27;
  }
  iVar27 = cpu_support_x86_f16c();
  if ((iVar27 != 0) && (opt->use_fp16_storage == true)) {
    iVar27 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar27;
  }
  local_d0 = bottom_blob->dims;
  if (local_d0 == 2) {
    local_cc = bottom_blob->w;
    if (local_cc ==
        *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
        *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3])) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]),
                  bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var15 = this->_vptr_InnerProduct_x86_fma[-3];
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 *(Mat **)(&this->field_0x178 + (long)p_Var15),
                 *(int *)(&this->field_0xe0 + (long)p_Var15),
                 (Mat *)(&this->field_0xe8 + (long)p_Var15),
                 (Option *)CONCAT44(in_stack_fffffffffffffe7c,(uint)opt->use_packing_layout));
      return 0;
    }
  }
  else {
    local_cc = bottom_blob->w;
  }
  piVar16 = bottom_blob->refcount;
  local_f8._0_8_ = bottom_blob->data;
  local_f8._8_8_ = bottom_blob->refcount;
  local_e8 = bottom_blob->elemsize;
  local_e0 = bottom_blob->elempack;
  local_d8 = bottom_blob->allocator;
  local_c8._0_4_ = bottom_blob->h;
  local_c8._4_4_ = bottom_blob->d;
  local_c0 = bottom_blob->c;
  local_b8 = bottom_blob->cstep;
  iVar27 = local_d0;
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + 1;
    UNLOCK();
    iVar27 = bottom_blob->dims;
  }
  if (iVar27 != 1) {
    auVar246[0] = opt->lightmode;
    auVar246._1_3_ = *(undefined3 *)&opt->field_0x1;
    auVar246._4_4_ = opt->num_threads;
    auVar246._8_8_ = opt->blob_allocator;
    uVar8 = opt->workspace_allocator;
    uVar9 = opt->openmp_blocktime;
    uVar10 = opt->use_winograd_convolution;
    uVar11 = opt->use_sgemm_convolution;
    uVar12 = opt->use_int8_inference;
    uVar13 = opt->use_vulkan_compute;
    auVar246[0x1f] = uVar13;
    auVar246[0x1e] = uVar12;
    auVar246[0x1d] = uVar11;
    auVar246[0x1c] = uVar10;
    auVar246._24_4_ = uVar9;
    auVar246._16_8_ = uVar8;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_1_ = opt->use_shader_pack8;
    uStack_50._1_1_ = opt->use_subgroup_basic;
    uStack_50._2_1_ = opt->use_subgroup_vote;
    uStack_50._3_1_ = opt->use_subgroup_ballot;
    uStack_50._4_1_ = opt->use_subgroup_shuffle;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_0;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = opt->use_reserved_7;
    uStack_40._4_1_ = opt->use_reserved_8;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar246._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar246._16_16_;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,local_f8);
  }
  uVar14 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]);
  uVar28 = 1;
  if (opt->use_packing_layout == true) {
    uVar28 = 8;
    if ((uVar14 & 7) != 0) {
      uVar28 = (uint)((uVar14 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar14 / (int)uVar28,(ulong)uVar28 * (local_e8 / (ulong)(long)local_e0),
              uVar28,opt->blob_allocator);
  iVar27 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    p_Var15 = this->_vptr_InnerProduct_x86_fma[-3];
    uVar14 = *(uint *)(&this->field_0xe0 + (long)p_Var15);
    lVar17 = *(long *)(&this->field_0x178 + (long)p_Var15);
    uVar46 = local_e0 * local_cc;
    iVar33 = top_blob->elempack;
    uVar28 = top_blob->w;
    uVar26 = local_f8._0_8_;
    if (iVar33 == 1) {
      lVar39 = (long)(int)uVar46;
      if (0 < (int)uVar28 >> 3) {
        local_88 = (ulong)(uint)((int)uVar28 >> 3);
        lVar35 = lVar39 * 0x1c;
        local_90 = lVar39 * 0x20;
        lVar40 = lVar39 * 8;
        lVar38 = lVar39 * 0x18;
        local_100 = lVar39 * 4;
        lVar42 = lVar39 * 0x14;
        local_108 = lVar39 << 4;
        local_110 = lVar39 * 0xc;
        local_118 = 0;
        auVar252 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar101 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar29 = 0;
        do {
          uVar36 = uVar29 * 8;
          auVar161 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar17 != 0) {
            auVar161 = ZEXT3264(*(undefined1 (*) [32])(lVar17 + uVar29 * 0x20));
          }
          auVar246 = auVar161._0_32_;
          pvVar31 = (this->weight_data_tm).data;
          if ((int)uVar46 < 8) {
            uVar43 = 0;
            lVar44 = uVar36 * lVar39 * 4;
            lVar45 = (uVar36 | 1) * lVar39 * 4;
            lVar1 = (uVar36 | 2) * lVar39 * 4;
            lVar2 = (uVar36 | 3) * lVar39 * 4;
            lVar3 = (uVar36 | 4) * lVar39 * 4;
            lVar4 = (uVar36 | 5) * lVar39 * 4;
            lVar5 = (uVar36 | 6) * lVar39 * 4;
            lVar6 = (uVar36 | 7) * lVar39 * 4;
            auVar180 = SUB6432(ZEXT864(0),0);
            auVar54 = ZEXT816(0);
            auVar93 = SUB6432(ZEXT864(0),0);
            auVar167 = ZEXT816(0);
            auVar62 = SUB6432(ZEXT864(0),0);
            auVar91 = SUB6432(ZEXT864(0),0);
            auVar160 = SUB6432(ZEXT864(0),0);
            auVar163 = ZEXT816(0);
            pauVar34 = (undefined1 (*) [32])local_f8._0_8_;
            local_a0 = lVar40;
            local_98 = lVar35;
          }
          else {
            auVar163 = ZEXT816(0);
            iVar27 = 7;
            auVar305 = ZEXT864(0);
            auVar240 = ZEXT864(0);
            auVar373 = ZEXT864(0);
            auVar167 = ZEXT816(0);
            auVar197 = ZEXT864(0);
            auVar54 = ZEXT816(0);
            auVar341 = ZEXT864(0);
            lVar44 = 0;
            do {
              lVar32 = lVar44;
              auVar180 = *(undefined1 (*) [32])((undefined1 *)local_f8._0_8_ + lVar32);
              auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),auVar180,
                                         *(undefined1 (*) [32])((long)pvVar31 + lVar32 + local_118))
              ;
              auVar105 = vfmadd231ps_fma(auVar305._0_32_,auVar180,
                                         *(undefined1 (*) [32])((long)pvVar31 + lVar32 + local_100))
              ;
              auVar305 = ZEXT1664(auVar105);
              auVar160 = ZEXT1632(auVar105);
              auVar105 = vfmadd231ps_fma(auVar240._0_32_,auVar180,
                                         *(undefined1 (*) [32])((long)pvVar31 + lVar32 + lVar40));
              auVar240 = ZEXT1664(auVar105);
              auVar91 = ZEXT1632(auVar105);
              auVar105 = vfmadd231ps_fma(auVar373._0_32_,auVar180,
                                         *(undefined1 (*) [32])((long)pvVar31 + lVar32 + local_110))
              ;
              auVar373 = ZEXT1664(auVar105);
              auVar62 = ZEXT1632(auVar105);
              auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar180,
                                         *(undefined1 (*) [32])((long)pvVar31 + lVar32 + local_108))
              ;
              auVar105 = vfmadd231ps_fma(auVar197._0_32_,auVar180,
                                         *(undefined1 (*) [32])((long)pvVar31 + lVar32 + lVar42));
              auVar197 = ZEXT1664(auVar105);
              auVar93 = ZEXT1632(auVar105);
              auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar180,
                                        *(undefined1 (*) [32])((long)pvVar31 + lVar32 + lVar38));
              auVar105 = vfmadd231ps_fma(auVar341._0_32_,auVar180,
                                         *(undefined1 (*) [32])((long)pvVar31 + lVar32 + lVar35));
              auVar341 = ZEXT1664(auVar105);
              auVar180 = ZEXT1632(auVar105);
              iVar27 = iVar27 + 8;
              lVar44 = lVar32 + 0x20;
            } while (iVar27 < (int)uVar46);
            lVar6 = lVar44 + lVar35;
            lVar5 = lVar44 + lVar38;
            lVar4 = lVar44 + lVar42;
            lVar3 = lVar44 + local_108;
            lVar2 = lVar44 + local_110;
            lVar1 = lVar44 + lVar40;
            lVar45 = lVar44 + local_100;
            lVar44 = lVar44 + local_118;
            pauVar34 = (undefined1 (*) [32])(*(undefined1 (*) [32])(local_f8._0_8_ + 0x20) + lVar32)
            ;
            uVar43 = uVar46 & 0xfffffff8;
          }
          auVar105 = auVar160._0_16_;
          if (uVar46 - uVar43 != 0 && (int)uVar43 <= (int)uVar46) {
            lVar32 = 0;
            do {
              auVar356 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar31 + lVar32 * 4 + lVar3)),
                                       ZEXT416(*(uint *)((long)pvVar31 + lVar32 * 4 + lVar4)),0x10);
              auVar356 = vinsertps_avx(auVar356,ZEXT416(*(uint *)((long)pvVar31 + lVar32 * 4 + lVar5
                                                                 )),0x20);
              auVar356 = vinsertps_avx(auVar356,ZEXT416(*(uint *)((long)pvVar31 + lVar32 * 4 + lVar6
                                                                 )),0x30);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar31 + lVar32 * 4 + lVar44)),
                                      ZEXT416(*(uint *)((long)pvVar31 + lVar32 * 4 + lVar45)),0x10);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)((long)pvVar31 + lVar32 * 4 + lVar1))
                                      ,0x20);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)((long)pvVar31 + lVar32 * 4 + lVar2))
                                      ,0x30);
              uVar7 = *(undefined4 *)(*pauVar34 + lVar32 * 4);
              auVar248._4_4_ = uVar7;
              auVar248._0_4_ = uVar7;
              auVar248._8_4_ = uVar7;
              auVar248._12_4_ = uVar7;
              auVar248._16_4_ = uVar7;
              auVar248._20_4_ = uVar7;
              auVar248._24_4_ = uVar7;
              auVar248._28_4_ = uVar7;
              auVar295._16_16_ = auVar356;
              auVar295._0_16_ = auVar75;
              auVar356 = vfmadd231ps_fma(auVar161._0_32_,auVar295,auVar248);
              auVar161 = ZEXT1664(auVar356);
              auVar246 = ZEXT1632(auVar356);
              lVar32 = lVar32 + 1;
            } while (uVar46 - uVar43 != (int)lVar32);
          }
          auVar160 = vhaddps_avx(ZEXT1632(auVar163),auVar160);
          auVar62 = vhaddps_avx(auVar91,auVar62);
          auVar62 = vhaddps_avx(auVar160,auVar62);
          auVar93 = vhaddps_avx(ZEXT1632(auVar167),auVar93);
          auVar91 = vhaddps_avx(ZEXT1632(auVar54),auVar180);
          auVar91 = vhaddps_avx(auVar93,auVar91);
          auVar93 = vblendps_avx(auVar62,auVar91,0xf0);
          auVar91 = vperm2f128_avx(auVar62,auVar91,0x21);
          fVar103 = auVar91._0_4_ + auVar93._0_4_ + auVar246._0_4_;
          fVar66 = auVar91._4_4_ + auVar93._4_4_ + auVar246._4_4_;
          auVar62._0_8_ = CONCAT44(fVar66,fVar103);
          auVar62._8_4_ = auVar91._8_4_ + auVar93._8_4_ + auVar246._8_4_;
          auVar62._12_4_ = auVar91._12_4_ + auVar93._12_4_ + auVar246._12_4_;
          auVar62._16_4_ = auVar91._16_4_ + auVar93._16_4_ + auVar246._16_4_;
          auVar62._20_4_ = auVar91._20_4_ + auVar93._20_4_ + auVar246._20_4_;
          auVar62._24_4_ = auVar91._24_4_ + auVar93._24_4_ + auVar246._24_4_;
          auVar62._28_4_ = auVar91._28_4_ + auVar93._28_4_ + auVar246._28_4_;
          auVar93 = auVar101._0_32_;
          auVar246 = auVar252._0_32_;
          fVar306 = auVar252._0_4_;
          fVar162 = auVar252._4_4_;
          fVar326 = auVar252._8_4_;
          fVar327 = auVar252._12_4_;
          fVar328 = auVar252._16_4_;
          fVar329 = auVar252._20_4_;
          fVar67 = auVar252._24_4_;
          fVar102 = auVar252._28_4_;
          switch(uVar14) {
          case 1:
            auVar62 = vmaxps_avx(auVar93,auVar62);
            break;
          case 2:
            auVar246 = vmaxps_avx(auVar93,auVar62);
            auVar93 = vminps_avx(auVar93,auVar62);
            uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
            auVar65._4_4_ = uVar7;
            auVar65._0_4_ = uVar7;
            auVar65._8_4_ = uVar7;
            auVar65._12_4_ = uVar7;
            auVar65._16_4_ = uVar7;
            auVar65._20_4_ = uVar7;
            auVar65._24_4_ = uVar7;
            auVar65._28_4_ = uVar7;
            auVar163 = vfmadd213ps_fma(auVar65,auVar93,auVar246);
            auVar62 = ZEXT1632(auVar163);
            break;
          case 3:
            uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
            auVar96._4_4_ = uVar7;
            auVar96._0_4_ = uVar7;
            auVar96._8_4_ = uVar7;
            auVar96._12_4_ = uVar7;
            auVar96._16_4_ = uVar7;
            auVar96._20_4_ = uVar7;
            auVar96._24_4_ = uVar7;
            auVar96._28_4_ = uVar7;
            uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var15))[1];
            auVar157._4_4_ = uVar7;
            auVar157._0_4_ = uVar7;
            auVar157._8_4_ = uVar7;
            auVar157._12_4_ = uVar7;
            auVar157._16_4_ = uVar7;
            auVar157._20_4_ = uVar7;
            auVar157._24_4_ = uVar7;
            auVar157._28_4_ = uVar7;
            auVar246 = vmaxps_avx(auVar62,auVar96);
            auVar62 = vminps_avx(auVar246,auVar157);
            break;
          case 4:
            auVar61._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
            auVar61._8_4_ = -auVar62._8_4_;
            auVar61._12_4_ = -auVar62._12_4_;
            auVar61._16_4_ = -auVar62._16_4_;
            auVar61._20_4_ = -auVar62._20_4_;
            auVar61._24_4_ = -auVar62._24_4_;
            auVar61._28_4_ = -auVar62._28_4_;
            auVar97._8_4_ = 0x42b0c0a5;
            auVar97._0_8_ = 0x42b0c0a542b0c0a5;
            auVar97._12_4_ = 0x42b0c0a5;
            auVar97._16_4_ = 0x42b0c0a5;
            auVar97._20_4_ = 0x42b0c0a5;
            auVar97._24_4_ = 0x42b0c0a5;
            auVar97._28_4_ = 0x42b0c0a5;
            auVar93 = vminps_avx(auVar61,auVar97);
            auVar98._8_4_ = 0xc2b0c0a5;
            auVar98._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar98._12_4_ = 0xc2b0c0a5;
            auVar98._16_4_ = 0xc2b0c0a5;
            auVar98._20_4_ = 0xc2b0c0a5;
            auVar98._24_4_ = 0xc2b0c0a5;
            auVar98._28_4_ = 0xc2b0c0a5;
            auVar62 = vmaxps_avx(auVar93,auVar98);
            auVar99._8_4_ = 0x3fb8aa3b;
            auVar99._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar99._12_4_ = 0x3fb8aa3b;
            auVar99._16_4_ = 0x3fb8aa3b;
            auVar99._20_4_ = 0x3fb8aa3b;
            auVar99._24_4_ = 0x3fb8aa3b;
            auVar99._28_4_ = 0x3fb8aa3b;
            auVar279._8_4_ = 0x3f000000;
            auVar279._0_8_ = 0x3f0000003f000000;
            auVar279._12_4_ = 0x3f000000;
            auVar279._16_4_ = 0x3f000000;
            auVar279._20_4_ = 0x3f000000;
            auVar279._24_4_ = 0x3f000000;
            auVar279._28_4_ = 0x3f000000;
            auVar163 = vfmadd213ps_fma(auVar99,auVar62,auVar279);
            auVar91 = vroundps_avx(ZEXT1632(auVar163),1);
            auVar93 = vcmpps_avx(ZEXT1632(auVar163),auVar91,1);
            auVar93 = vandps_avx(auVar93,auVar246);
            auVar93 = vsubps_avx(auVar91,auVar93);
            auVar158._8_4_ = 0x3f318000;
            auVar158._0_8_ = 0x3f3180003f318000;
            auVar158._12_4_ = 0x3f318000;
            auVar158._16_4_ = 0x3f318000;
            auVar158._20_4_ = 0x3f318000;
            auVar158._24_4_ = 0x3f318000;
            auVar158._28_4_ = 0x3f318000;
            auVar163 = vfmsub231ps_fma(auVar62,auVar93,auVar158);
            auVar159._8_4_ = 0x395e8083;
            auVar159._0_8_ = 0x395e8083395e8083;
            auVar159._12_4_ = 0x395e8083;
            auVar159._16_4_ = 0x395e8083;
            auVar159._20_4_ = 0x395e8083;
            auVar159._24_4_ = 0x395e8083;
            auVar159._28_4_ = 0x395e8083;
            auVar167 = vfmsub231ps_fma(ZEXT1632(auVar163),auVar93,auVar159);
            auVar62 = ZEXT1632(auVar167);
            auVar24._28_4_ = 0x395e8083;
            auVar24._0_28_ =
                 ZEXT1628(CONCAT412(auVar167._12_4_ * auVar167._12_4_,
                                    CONCAT48(auVar167._8_4_ * auVar167._8_4_,
                                             CONCAT44(auVar167._4_4_ * auVar167._4_4_,
                                                      auVar167._0_4_ * auVar167._0_4_))));
            auVar228._8_4_ = 0x39506967;
            auVar228._0_8_ = 0x3950696739506967;
            auVar228._12_4_ = 0x39506967;
            auVar228._16_4_ = 0x39506967;
            auVar228._20_4_ = 0x39506967;
            auVar228._24_4_ = 0x39506967;
            auVar228._28_4_ = 0x39506967;
            auVar250._8_4_ = 0x3ab743ce;
            auVar250._0_8_ = 0x3ab743ce3ab743ce;
            auVar250._12_4_ = 0x3ab743ce;
            auVar250._16_4_ = 0x3ab743ce;
            auVar250._20_4_ = 0x3ab743ce;
            auVar250._24_4_ = 0x3ab743ce;
            auVar250._28_4_ = 0x3ab743ce;
            auVar163 = vfmadd213ps_fma(auVar228,auVar62,auVar250);
            auVar251._8_4_ = 0x3c088908;
            auVar251._0_8_ = 0x3c0889083c088908;
            auVar251._12_4_ = 0x3c088908;
            auVar251._16_4_ = 0x3c088908;
            auVar251._20_4_ = 0x3c088908;
            auVar251._24_4_ = 0x3c088908;
            auVar251._28_4_ = 0x3c088908;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar62,auVar251);
            auVar195._8_4_ = 0x3d2aa9c1;
            auVar195._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar195._12_4_ = 0x3d2aa9c1;
            auVar195._16_4_ = 0x3d2aa9c1;
            auVar195._20_4_ = 0x3d2aa9c1;
            auVar195._24_4_ = 0x3d2aa9c1;
            auVar195._28_4_ = 0x3d2aa9c1;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar62,auVar195);
            auVar196._8_4_ = 0x3e2aaaaa;
            auVar196._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar196._12_4_ = 0x3e2aaaaa;
            auVar196._16_4_ = 0x3e2aaaaa;
            auVar196._20_4_ = 0x3e2aaaaa;
            auVar196._24_4_ = 0x3e2aaaaa;
            auVar196._28_4_ = 0x3e2aaaaa;
            auVar62 = ZEXT1632(auVar167);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar62,auVar196);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar62,auVar279);
            auVar54 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar24,auVar62);
            auVar53._0_4_ = (int)auVar93._0_4_;
            auVar53._4_4_ = (int)auVar93._4_4_;
            auVar53._8_4_ = (int)auVar93._8_4_;
            auVar53._12_4_ = (int)auVar93._12_4_;
            auVar63._16_4_ = (int)auVar93._16_4_;
            auVar63._0_16_ = auVar53;
            auVar63._20_4_ = (int)auVar93._20_4_;
            auVar63._24_4_ = (int)auVar93._24_4_;
            auVar63._28_4_ = (int)auVar93._28_4_;
            auVar167 = vpslld_avx(auVar53,0x17);
            auVar163 = vpslld_avx(auVar63._16_16_,0x17);
            auVar118._8_4_ = 0x3f800000;
            auVar118._0_8_ = 0x3f8000003f800000;
            auVar118._12_4_ = 0x3f800000;
            auVar163 = vpaddd_avx(auVar163,auVar118);
            auVar167 = vpaddd_avx(auVar167,auVar118);
            auVar64._16_16_ = auVar163;
            auVar64._0_16_ = auVar167;
            auVar100._0_4_ = auVar54._0_4_ + fVar306;
            auVar100._4_4_ = auVar54._4_4_ + fVar162;
            auVar100._8_4_ = auVar54._8_4_ + fVar326;
            auVar100._12_4_ = auVar54._12_4_ + fVar327;
            auVar100._16_4_ = fVar328 + 0.0;
            auVar100._20_4_ = fVar329 + 0.0;
            auVar100._24_4_ = fVar67 + 0.0;
            auVar100._28_4_ = fVar102 + 0.0;
            auVar163 = vfmadd213ps_fma(auVar64,auVar100,auVar246);
            auVar93 = vrcpps_avx(ZEXT1632(auVar163));
            auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar93,auVar246);
            auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar93,auVar93);
            auVar62 = ZEXT1632(auVar163);
            break;
          case 5:
            auVar324._8_4_ = 0x42b0c0a5;
            auVar324._0_8_ = 0x42b0c0a542b0c0a5;
            auVar324._12_4_ = 0x42b0c0a5;
            auVar324._16_4_ = 0x42b0c0a5;
            auVar324._20_4_ = 0x42b0c0a5;
            auVar324._24_4_ = 0x42b0c0a5;
            auVar324._28_4_ = 0x42b0c0a5;
            auVar93 = vminps_avx(auVar324,auVar62);
            auVar338._8_4_ = 0xc2b0c0a5;
            auVar338._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar338._12_4_ = 0xc2b0c0a5;
            auVar338._16_4_ = 0xc2b0c0a5;
            auVar338._20_4_ = 0xc2b0c0a5;
            auVar338._24_4_ = 0xc2b0c0a5;
            auVar338._28_4_ = 0xc2b0c0a5;
            auVar91 = vmaxps_avx(auVar338,auVar93);
            auVar149._8_4_ = 0x3fb8aa3b;
            auVar149._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar149._12_4_ = 0x3fb8aa3b;
            auVar149._16_4_ = 0x3fb8aa3b;
            auVar149._20_4_ = 0x3fb8aa3b;
            auVar149._24_4_ = 0x3fb8aa3b;
            auVar149._28_4_ = 0x3fb8aa3b;
            auVar193._8_4_ = 0x3f000000;
            auVar193._0_8_ = 0x3f0000003f000000;
            auVar193._12_4_ = 0x3f000000;
            auVar193._16_4_ = 0x3f000000;
            auVar193._20_4_ = 0x3f000000;
            auVar193._24_4_ = 0x3f000000;
            auVar193._28_4_ = 0x3f000000;
            auVar105 = vfmadd213ps_fma(auVar149,auVar91,auVar193);
            auVar160 = vroundps_avx(ZEXT1632(auVar105),1);
            auVar93 = vcmpps_avx(ZEXT1632(auVar105),auVar160,1);
            auVar93 = vandps_avx(auVar93,auVar246);
            auVar93 = vsubps_avx(auVar160,auVar93);
            auVar353._8_4_ = 0x3f318000;
            auVar353._0_8_ = 0x3f3180003f318000;
            auVar353._12_4_ = 0x3f318000;
            auVar353._16_4_ = 0x3f318000;
            auVar353._20_4_ = 0x3f318000;
            auVar353._24_4_ = 0x3f318000;
            auVar353._28_4_ = 0x3f318000;
            auVar105 = vfmsub231ps_fma(auVar91,auVar93,auVar353);
            auVar339._8_4_ = 0xb95e8083;
            auVar339._0_8_ = 0xb95e8083b95e8083;
            auVar339._12_4_ = 0xb95e8083;
            auVar339._16_4_ = 0xb95e8083;
            auVar339._20_4_ = 0xb95e8083;
            auVar339._24_4_ = 0xb95e8083;
            auVar339._28_4_ = 0xb95e8083;
            auVar167 = vfnmsub231ps_fma(ZEXT1632(auVar105),auVar93,auVar339);
            auVar91 = ZEXT1632(auVar167);
            auVar180._28_4_ = auVar160._28_4_;
            auVar180._0_28_ =
                 ZEXT1628(CONCAT412(auVar167._12_4_ * auVar167._12_4_,
                                    CONCAT48(auVar167._8_4_ * auVar167._8_4_,
                                             CONCAT44(auVar167._4_4_ * auVar167._4_4_,
                                                      auVar167._0_4_ * auVar167._0_4_))));
            auVar372._8_4_ = 0x39506967;
            auVar372._0_8_ = 0x3950696739506967;
            auVar372._12_4_ = 0x39506967;
            auVar372._16_4_ = 0x39506967;
            auVar372._20_4_ = 0x39506967;
            auVar372._24_4_ = 0x39506967;
            auVar372._28_4_ = 0x39506967;
            auVar363._8_4_ = 0x3ab743ce;
            auVar363._0_8_ = 0x3ab743ce3ab743ce;
            auVar363._12_4_ = 0x3ab743ce;
            auVar363._16_4_ = 0x3ab743ce;
            auVar363._20_4_ = 0x3ab743ce;
            auVar363._24_4_ = 0x3ab743ce;
            auVar363._28_4_ = 0x3ab743ce;
            auVar105 = vfmadd213ps_fma(auVar372,auVar91,auVar363);
            auVar263._8_4_ = 0x3c088908;
            auVar263._0_8_ = 0x3c0889083c088908;
            auVar263._12_4_ = 0x3c088908;
            auVar263._16_4_ = 0x3c088908;
            auVar263._20_4_ = 0x3c088908;
            auVar263._24_4_ = 0x3c088908;
            auVar263._28_4_ = 0x3c088908;
            auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar91,auVar263);
            auVar194._8_4_ = 0x3d2aa9c1;
            auVar194._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar194._12_4_ = 0x3d2aa9c1;
            auVar194._16_4_ = 0x3d2aa9c1;
            auVar194._20_4_ = 0x3d2aa9c1;
            auVar194._24_4_ = 0x3d2aa9c1;
            auVar194._28_4_ = 0x3d2aa9c1;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar91,auVar194);
            auVar105._8_4_ = 0x3e2aaaaa;
            auVar105._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar105._12_4_ = 0x3e2aaaaa;
            auVar346._16_4_ = 0x3e2aaaaa;
            auVar346._0_16_ = auVar105;
            auVar346._20_4_ = 0x3e2aaaaa;
            auVar346._24_4_ = 0x3e2aaaaa;
            auVar346._28_4_ = 0x3e2aaaaa;
            auVar91 = ZEXT1632(auVar167);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar91,auVar346);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar91,auVar193);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar180,auVar91);
            auVar225._0_4_ = fVar306 + auVar163._0_4_;
            auVar225._4_4_ = fVar162 + auVar163._4_4_;
            auVar225._8_4_ = fVar326 + auVar163._8_4_;
            auVar225._12_4_ = fVar327 + auVar163._12_4_;
            auVar225._16_4_ = fVar328 + 0.0;
            auVar225._20_4_ = fVar329 + 0.0;
            auVar225._24_4_ = fVar67 + 0.0;
            auVar225._28_4_ = fVar102 + 0.0;
            auVar163._0_4_ = (int)auVar93._0_4_;
            auVar163._4_4_ = (int)auVar93._4_4_;
            auVar163._8_4_ = (int)auVar93._8_4_;
            auVar163._12_4_ = (int)auVar93._12_4_;
            auVar92._16_4_ = (int)auVar93._16_4_;
            auVar92._0_16_ = auVar163;
            auVar92._20_4_ = (int)auVar93._20_4_;
            auVar92._24_4_ = (int)auVar93._24_4_;
            auVar92._28_4_ = (int)auVar93._28_4_;
            auVar167 = vpslld_avx(auVar163,0x17);
            auVar163 = vpslld_avx(auVar92._16_16_,0x17);
            auVar356._8_4_ = 0x3f800000;
            auVar356._0_8_ = 0x3f8000003f800000;
            auVar356._12_4_ = 0x3f800000;
            auVar163 = vpaddd_avx(auVar163,auVar356);
            auVar167 = vpaddd_avx(auVar167,auVar356);
            auVar93._16_16_ = auVar163;
            auVar93._0_16_ = auVar167;
            auVar54 = vfmadd213ps_fma(auVar93,auVar225,auVar246);
            auVar150._8_4_ = 0x800000;
            auVar150._0_8_ = 0x80000000800000;
            auVar150._12_4_ = 0x800000;
            auVar150._16_4_ = 0x800000;
            auVar150._20_4_ = 0x800000;
            auVar150._24_4_ = 0x800000;
            auVar150._28_4_ = 0x800000;
            auVar93 = vmaxps_avx(ZEXT1632(auVar54),auVar150);
            auVar167 = vpsrld_avx(auVar93._0_16_,0x17);
            auVar163 = vpsrld_avx(auVar93._16_16_,0x17);
            auVar274._8_4_ = 0x807fffff;
            auVar274._0_8_ = 0x807fffff807fffff;
            auVar274._12_4_ = 0x807fffff;
            auVar274._16_4_ = 0x807fffff;
            auVar274._20_4_ = 0x807fffff;
            auVar274._24_4_ = 0x807fffff;
            auVar274._28_4_ = 0x807fffff;
            auVar93 = vandps_avx(auVar274,auVar93);
            auVar160 = vorps_avx(auVar93,auVar193);
            auVar275._8_4_ = 0x3f3504f3;
            auVar275._0_8_ = 0x3f3504f33f3504f3;
            auVar275._12_4_ = 0x3f3504f3;
            auVar275._16_4_ = 0x3f3504f3;
            auVar275._20_4_ = 0x3f3504f3;
            auVar275._24_4_ = 0x3f3504f3;
            auVar275._28_4_ = 0x3f3504f3;
            auVar91 = vcmpps_avx(auVar275,auVar160,2);
            auVar93 = vandnps_avx(auVar91,auVar160);
            auVar264._8_4_ = 0xbf800000;
            auVar264._0_8_ = 0xbf800000bf800000;
            auVar264._12_4_ = 0xbf800000;
            auVar264._16_4_ = 0xbf800000;
            auVar264._20_4_ = 0xbf800000;
            auVar264._24_4_ = 0xbf800000;
            auVar264._28_4_ = 0xbf800000;
            auVar151._0_4_ = auVar93._0_4_ + auVar160._0_4_ + -1.0;
            auVar151._4_4_ = auVar93._4_4_ + auVar160._4_4_ + -1.0;
            auVar151._8_4_ = auVar93._8_4_ + auVar160._8_4_ + -1.0;
            auVar151._12_4_ = auVar93._12_4_ + auVar160._12_4_ + -1.0;
            auVar151._16_4_ = auVar93._16_4_ + auVar160._16_4_ + -1.0;
            auVar151._20_4_ = auVar93._20_4_ + auVar160._20_4_ + -1.0;
            auVar151._24_4_ = auVar93._24_4_ + auVar160._24_4_ + -1.0;
            auVar151._28_4_ = auVar93._28_4_ + auVar160._28_4_ + -1.0;
            auVar163 = vpsubd_avx(auVar163,auVar91._16_16_);
            auVar75._8_4_ = 0xffffff81;
            auVar75._0_8_ = 0xffffff81ffffff81;
            auVar75._12_4_ = 0xffffff81;
            auVar163 = vpaddd_avx(auVar75,auVar163);
            auVar167 = vpsubd_avx(auVar167,auVar91._0_16_);
            auVar167 = vpaddd_avx(auVar75,auVar167);
            auVar226._16_16_ = auVar163;
            auVar226._0_16_ = auVar167;
            auVar249._0_4_ = auVar151._0_4_ * auVar151._0_4_;
            auVar249._4_4_ = auVar151._4_4_ * auVar151._4_4_;
            auVar249._8_4_ = auVar151._8_4_ * auVar151._8_4_;
            auVar249._12_4_ = auVar151._12_4_ * auVar151._12_4_;
            auVar249._16_4_ = auVar151._16_4_ * auVar151._16_4_;
            auVar249._20_4_ = auVar151._20_4_ * auVar151._20_4_;
            auVar249._24_4_ = auVar151._24_4_ * auVar151._24_4_;
            auVar249._28_4_ = 0;
            auVar276._8_4_ = 0x3d9021bb;
            auVar276._0_8_ = 0x3d9021bb3d9021bb;
            auVar276._12_4_ = 0x3d9021bb;
            auVar276._16_4_ = 0x3d9021bb;
            auVar276._20_4_ = 0x3d9021bb;
            auVar276._24_4_ = 0x3d9021bb;
            auVar276._28_4_ = 0x3d9021bb;
            auVar296._8_4_ = 0xbdebd1b8;
            auVar296._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar296._12_4_ = 0xbdebd1b8;
            auVar296._16_4_ = 0xbdebd1b8;
            auVar296._20_4_ = 0xbdebd1b8;
            auVar296._24_4_ = 0xbdebd1b8;
            auVar296._28_4_ = 0xbdebd1b8;
            auVar163 = vfmadd213ps_fma(auVar276,auVar151,auVar296);
            auVar297._8_4_ = 0x3def251a;
            auVar297._0_8_ = 0x3def251a3def251a;
            auVar297._12_4_ = 0x3def251a;
            auVar297._16_4_ = 0x3def251a;
            auVar297._20_4_ = 0x3def251a;
            auVar297._24_4_ = 0x3def251a;
            auVar297._28_4_ = 0x3def251a;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar151,auVar297);
            auVar298._8_4_ = 0xbdfe5d4f;
            auVar298._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar298._12_4_ = 0xbdfe5d4f;
            auVar298._16_4_ = 0xbdfe5d4f;
            auVar298._20_4_ = 0xbdfe5d4f;
            auVar298._24_4_ = 0xbdfe5d4f;
            auVar298._28_4_ = 0xbdfe5d4f;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar151,auVar298);
            auVar299._8_4_ = 0x3e11e9bf;
            auVar299._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar299._12_4_ = 0x3e11e9bf;
            auVar299._16_4_ = 0x3e11e9bf;
            auVar299._20_4_ = 0x3e11e9bf;
            auVar299._24_4_ = 0x3e11e9bf;
            auVar299._28_4_ = 0x3e11e9bf;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar151,auVar299);
            auVar300._8_4_ = 0xbe2aae50;
            auVar300._0_8_ = 0xbe2aae50be2aae50;
            auVar300._12_4_ = 0xbe2aae50;
            auVar300._16_4_ = 0xbe2aae50;
            auVar300._20_4_ = 0xbe2aae50;
            auVar300._24_4_ = 0xbe2aae50;
            auVar300._28_4_ = 0xbe2aae50;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar151,auVar300);
            auVar301._8_4_ = 0x3e4cceac;
            auVar301._0_8_ = 0x3e4cceac3e4cceac;
            auVar301._12_4_ = 0x3e4cceac;
            auVar301._16_4_ = 0x3e4cceac;
            auVar301._20_4_ = 0x3e4cceac;
            auVar301._24_4_ = 0x3e4cceac;
            auVar301._28_4_ = 0x3e4cceac;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar151,auVar301);
            auVar302._8_4_ = 0xbe7ffffc;
            auVar302._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar302._12_4_ = 0xbe7ffffc;
            auVar302._16_4_ = 0xbe7ffffc;
            auVar302._20_4_ = 0xbe7ffffc;
            auVar302._24_4_ = 0xbe7ffffc;
            auVar302._28_4_ = 0xbe7ffffc;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar151,auVar302);
            auVar303._8_4_ = 0x3eaaaaaa;
            auVar303._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar303._12_4_ = 0x3eaaaaaa;
            auVar303._16_4_ = 0x3eaaaaaa;
            auVar303._20_4_ = 0x3eaaaaaa;
            auVar303._24_4_ = 0x3eaaaaaa;
            auVar303._28_4_ = 0x3eaaaaaa;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar151,auVar303);
            auVar277._0_4_ = auVar249._0_4_ * auVar151._0_4_ * auVar163._0_4_;
            auVar277._4_4_ = auVar249._4_4_ * auVar151._4_4_ * auVar163._4_4_;
            auVar277._8_4_ = auVar249._8_4_ * auVar151._8_4_ * auVar163._8_4_;
            auVar277._12_4_ = auVar249._12_4_ * auVar151._12_4_ * auVar163._12_4_;
            auVar277._16_4_ = auVar249._16_4_ * auVar151._16_4_ * 0.0;
            auVar277._20_4_ = auVar249._20_4_ * auVar151._20_4_ * 0.0;
            auVar277._24_4_ = auVar249._24_4_ * auVar151._24_4_ * 0.0;
            auVar277._28_4_ = 0;
            auVar91 = vcvtdq2ps_avx(auVar226);
            auVar163 = vfmadd231ps_fma(auVar277,auVar91,auVar339);
            auVar163 = vfmsub231ps_fma(ZEXT1632(auVar163),auVar193,auVar249);
            auVar93 = vcmpps_avx(ZEXT1632(auVar54),_DAT_00557200,2);
            auVar160 = vsubps_avx(ZEXT1632(auVar163),auVar151);
            auVar163 = vfmsub231ps_fma(auVar160,auVar353,auVar91);
            auVar304._8_4_ = 0xc0000000;
            auVar304._0_8_ = 0xc0000000c0000000;
            auVar304._12_4_ = 0xc0000000;
            auVar304._16_4_ = 0xc0000000;
            auVar304._20_4_ = 0xc0000000;
            auVar304._24_4_ = 0xc0000000;
            auVar304._28_4_ = 0xc0000000;
            auVar152._0_4_ = auVar163._0_4_ * -2.0;
            auVar152._4_4_ = auVar163._4_4_ * -2.0;
            auVar152._8_4_ = auVar163._8_4_ * -2.0;
            auVar152._12_4_ = auVar163._12_4_ * -2.0;
            auVar152._16_4_ = 0x80000000;
            auVar152._20_4_ = 0x80000000;
            auVar152._24_4_ = 0x80000000;
            auVar152._28_4_ = 0;
            auVar227._8_4_ = 0x7fffffff;
            auVar227._0_8_ = 0x7fffffff7fffffff;
            auVar227._12_4_ = 0x7fffffff;
            auVar227._16_4_ = 0x7fffffff;
            auVar227._20_4_ = 0x7fffffff;
            auVar227._24_4_ = 0x7fffffff;
            auVar227._28_4_ = 0x7fffffff;
            auVar93 = vblendvps_avx(auVar152,auVar227,auVar93);
            auVar153._8_4_ = 0x42b0c0a5;
            auVar153._0_8_ = 0x42b0c0a542b0c0a5;
            auVar153._12_4_ = 0x42b0c0a5;
            auVar153._16_4_ = 0x42b0c0a5;
            auVar153._20_4_ = 0x42b0c0a5;
            auVar153._24_4_ = 0x42b0c0a5;
            auVar153._28_4_ = 0x42b0c0a5;
            auVar93 = vminps_avx(auVar93,auVar153);
            auVar154._8_4_ = 0xc2b0c0a5;
            auVar154._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar154._12_4_ = 0xc2b0c0a5;
            auVar154._16_4_ = 0xc2b0c0a5;
            auVar154._20_4_ = 0xc2b0c0a5;
            auVar154._24_4_ = 0xc2b0c0a5;
            auVar154._28_4_ = 0xc2b0c0a5;
            auVar91 = vmaxps_avx(auVar93,auVar154);
            auVar155._8_4_ = 0x3fb8aa3b;
            auVar155._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar155._12_4_ = 0x3fb8aa3b;
            auVar155._16_4_ = 0x3fb8aa3b;
            auVar155._20_4_ = 0x3fb8aa3b;
            auVar155._24_4_ = 0x3fb8aa3b;
            auVar155._28_4_ = 0x3fb8aa3b;
            auVar163 = vfmadd213ps_fma(auVar155,auVar91,auVar193);
            auVar160 = vroundps_avx(ZEXT1632(auVar163),1);
            auVar93 = vcmpps_avx(ZEXT1632(auVar163),auVar160,1);
            auVar93 = vandps_avx(auVar246,auVar93);
            auVar93 = vsubps_avx(auVar160,auVar93);
            auVar163 = vfmsub231ps_fma(auVar91,auVar93,auVar353);
            auVar167 = vfnmsub231ps_fma(ZEXT1632(auVar163),auVar93,auVar339);
            auVar91 = ZEXT1632(auVar167);
            auVar23._28_4_ = auVar160._28_4_;
            auVar23._0_28_ =
                 ZEXT1628(CONCAT412(auVar167._12_4_ * auVar167._12_4_,
                                    CONCAT48(auVar167._8_4_ * auVar167._8_4_,
                                             CONCAT44(auVar167._4_4_ * auVar167._4_4_,
                                                      auVar167._0_4_ * auVar167._0_4_))));
            auVar101 = ZEXT864(0) << 0x20;
            auVar163 = vfmadd213ps_fma(auVar372,auVar91,auVar363);
            auVar278._8_4_ = 0x3c088908;
            auVar278._0_8_ = 0x3c0889083c088908;
            auVar278._12_4_ = 0x3c088908;
            auVar278._16_4_ = 0x3c088908;
            auVar278._20_4_ = 0x3c088908;
            auVar278._24_4_ = 0x3c088908;
            auVar278._28_4_ = 0x3c088908;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar91,auVar278);
            auVar252 = ZEXT3264(auVar246);
            auVar325._8_4_ = 0x3d2aa9c1;
            auVar325._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar325._12_4_ = 0x3d2aa9c1;
            auVar325._16_4_ = 0x3d2aa9c1;
            auVar325._20_4_ = 0x3d2aa9c1;
            auVar325._24_4_ = 0x3d2aa9c1;
            auVar325._28_4_ = 0x3d2aa9c1;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar91,auVar325);
            auVar91 = ZEXT1632(auVar167);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar91,auVar346);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar91,auVar193);
            auVar54 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar23,auVar91);
            auVar167._0_4_ = (int)auVar93._0_4_;
            auVar167._4_4_ = (int)auVar93._4_4_;
            auVar167._8_4_ = (int)auVar93._8_4_;
            auVar167._12_4_ = (int)auVar93._12_4_;
            auVar94._16_4_ = (int)auVar93._16_4_;
            auVar94._0_16_ = auVar167;
            auVar94._20_4_ = (int)auVar93._20_4_;
            auVar94._24_4_ = (int)auVar93._24_4_;
            auVar94._28_4_ = (int)auVar93._28_4_;
            auVar167 = vpslld_avx(auVar167,0x17);
            auVar163 = vpslld_avx(auVar94._16_16_,0x17);
            auVar163 = vpaddd_avx(auVar163,auVar356);
            auVar167 = vpaddd_avx(auVar167,auVar356);
            auVar95._16_16_ = auVar163;
            auVar95._0_16_ = auVar167;
            auVar156._0_4_ = auVar54._0_4_ + fVar306;
            auVar156._4_4_ = auVar54._4_4_ + fVar162;
            auVar156._8_4_ = auVar54._8_4_ + fVar326;
            auVar156._12_4_ = auVar54._12_4_ + fVar327;
            auVar156._16_4_ = fVar328 + 0.0;
            auVar156._20_4_ = fVar329 + 0.0;
            auVar156._24_4_ = fVar67 + 0.0;
            auVar156._28_4_ = fVar102 + 0.0;
            auVar163 = vfmadd213ps_fma(auVar95,auVar156,auVar246);
            auVar93 = vrcpps_avx(ZEXT1632(auVar163));
            auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar93,auVar246);
            auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar93,auVar93);
            auVar163 = vfnmadd213ps_fma(ZEXT1632(auVar163),auVar304,auVar264);
            auVar138 = ZEXT1628(auVar163);
            goto LAB_002ce94e;
          case 6:
            uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
            auVar91._4_4_ = uVar7;
            auVar91._0_4_ = uVar7;
            auVar91._8_4_ = uVar7;
            auVar91._12_4_ = uVar7;
            auVar91._16_4_ = uVar7;
            auVar91._20_4_ = uVar7;
            auVar91._24_4_ = uVar7;
            auVar91._28_4_ = uVar7;
            uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var15))[1];
            auVar160._4_4_ = uVar7;
            auVar160._0_4_ = uVar7;
            auVar160._8_4_ = uVar7;
            auVar160._12_4_ = uVar7;
            auVar160._16_4_ = uVar7;
            auVar160._20_4_ = uVar7;
            auVar160._24_4_ = uVar7;
            auVar160._28_4_ = uVar7;
            auVar163 = vfmadd231ps_fma(auVar160,auVar62,auVar91);
            auVar93 = vmaxps_avx(auVar93,ZEXT1632(auVar163));
            auVar246 = vminps_avx(auVar93,auVar246);
            auVar138 = auVar246._0_28_;
LAB_002ce94e:
            auVar62._4_4_ = auVar138._4_4_ * fVar66;
            auVar62._0_4_ = auVar138._0_4_ * fVar103;
            auVar62._8_4_ = auVar138._8_4_ * auVar62._8_4_;
            auVar62._12_4_ = auVar138._12_4_ * auVar62._12_4_;
            auVar62._16_4_ = auVar138._16_4_ * auVar62._16_4_;
            auVar62._20_4_ = auVar138._20_4_ * auVar62._20_4_;
            auVar62._24_4_ = auVar138._24_4_ * auVar62._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar29 * 0x20) = auVar62;
          uVar29 = uVar29 + 1;
          lVar35 = lVar35 + local_90;
          lVar38 = lVar38 + local_90;
          lVar42 = lVar42 + local_90;
          local_108 = local_108 + local_90;
          local_110 = local_110 + local_90;
          lVar40 = lVar40 + local_90;
          local_100 = local_100 + local_90;
          local_118 = local_118 + local_90;
          local_a8 = p_Var15;
          local_80 = (ulong)uVar14;
        } while (uVar29 != local_88);
      }
      uVar29 = (long)(int)uVar28 & 0xfffffffffffffff8;
      if ((uVar28 >> 2 & 1) != 0) {
        if (lVar17 == 0) {
          auVar163 = ZEXT816(0) << 0x40;
        }
        else {
          auVar163 = *(undefined1 (*) [16])(lVar17 + uVar29 * 4);
        }
        pvVar18 = (this->weight_data_tm).data;
        pvVar31 = (void *)((long)pvVar18 + uVar29 * lVar39 * 4);
        if ((int)uVar46 < 8) {
          uVar43 = 0;
          lVar40 = (uVar29 | 1) * lVar39 * 4;
          lVar38 = (uVar29 | 2) * lVar39 * 4;
          lVar42 = (uVar29 | 3) * lVar39 * 4;
          auVar167 = ZEXT816(0);
          auVar54 = ZEXT816(0);
          auVar356 = ZEXT816(0);
          auVar75 = ZEXT816(0);
          pauVar34 = (undefined1 (*) [32])local_f8._0_8_;
        }
        else {
          uVar43 = uVar46 & 0xfffffff8;
          lVar40 = (uVar29 + 3) * lVar39;
          lVar38 = (uVar29 + 2) * lVar39;
          lVar44 = (uVar29 + 1) * lVar39;
          auVar75 = ZEXT816(0);
          iVar27 = 7;
          auVar356 = ZEXT816(0);
          auVar54 = ZEXT816(0);
          auVar167 = ZEXT816(0);
          lVar35 = 0;
          do {
            lVar45 = lVar35;
            auVar246 = *(undefined1 (*) [32])((undefined1 *)local_f8._0_8_ + lVar45);
            auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar246,
                                       *(undefined1 (*) [32])((long)pvVar31 + lVar45));
            auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar246,
                                      *(undefined1 (*) [32])((long)pvVar18 + lVar45 + lVar44 * 4));
            auVar356 = vfmadd231ps_fma(ZEXT1632(auVar356),auVar246,
                                       *(undefined1 (*) [32])((long)pvVar18 + lVar45 + lVar38 * 4));
            auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar246,
                                      *(undefined1 (*) [32])((long)pvVar18 + lVar45 + lVar40 * 4));
            iVar27 = iVar27 + 8;
            lVar35 = lVar45 + 0x20;
          } while (iVar27 < (int)uVar46);
          lVar42 = lVar35 + lVar40 * 4;
          lVar38 = lVar35 + lVar38 * 4;
          lVar40 = lVar35 + lVar44 * 4;
          pvVar31 = (void *)((long)pvVar31 + lVar35);
          pauVar34 = (undefined1 (*) [32])(*(undefined1 (*) [32])(local_f8._0_8_ + 0x20) + lVar45);
        }
        lVar40 = (long)pvVar18 + lVar40;
        lVar38 = (long)pvVar18 + lVar38;
        lVar42 = (long)pvVar18 + lVar42;
        auVar53 = ZEXT816(0) << 0x40;
        if ((int)(uVar43 | 3) < (int)uVar46) {
          auVar134 = ZEXT816(0);
          lVar35 = 0;
          auVar84 = ZEXT816(0);
          auVar252 = ZEXT864(0);
          uVar41 = uVar43;
          do {
            auVar135 = *(undefined1 (*) [16])(*pauVar34 + lVar35);
            auVar53 = vfmadd231ps_fma(auVar53,auVar135,
                                      *(undefined1 (*) [16])((long)pvVar31 + lVar35));
            auVar118 = vfmadd231ps_fma(auVar252._0_16_,auVar135,
                                       *(undefined1 (*) [16])(lVar40 + lVar35));
            auVar252 = ZEXT1664(auVar118);
            auVar84 = vfmadd231ps_fma(auVar84,auVar135,*(undefined1 (*) [16])(lVar38 + lVar35));
            auVar134 = vfmadd231ps_fma(auVar134,auVar135,*(undefined1 (*) [16])(lVar42 + lVar35));
            uVar43 = uVar41 + 4;
            iVar27 = uVar41 + 7;
            lVar35 = lVar35 + 0x10;
            uVar41 = uVar43;
          } while (iVar27 < (int)uVar46);
          pauVar34 = (undefined1 (*) [32])(*pauVar34 + lVar35);
          lVar42 = lVar42 + lVar35;
          lVar38 = lVar38 + lVar35;
          lVar40 = lVar40 + lVar35;
          pvVar31 = (void *)((long)pvVar31 + lVar35);
        }
        else {
          auVar118 = SUB6416(ZEXT864(0),0);
          auVar84 = ZEXT816(0);
          auVar134 = ZEXT816(0);
        }
        if (uVar46 - uVar43 != 0 && (int)uVar43 <= (int)uVar46) {
          lVar35 = 0;
          do {
            auVar135 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar31 + lVar35 * 4)),
                                     ZEXT416(*(uint *)(lVar40 + lVar35 * 4)),0x10);
            auVar135 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(lVar38 + lVar35 * 4)),0x20);
            auVar135 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(lVar42 + lVar35 * 4)),0x30);
            uVar7 = *(undefined4 *)(*pauVar34 + lVar35 * 4);
            auVar309._4_4_ = uVar7;
            auVar309._0_4_ = uVar7;
            auVar309._8_4_ = uVar7;
            auVar309._12_4_ = uVar7;
            auVar163 = vfmadd231ps_fma(auVar163,auVar135,auVar309);
            lVar35 = lVar35 + 1;
          } while (uVar46 - uVar43 != (int)lVar35);
        }
        auVar246 = vhaddps_avx(ZEXT1632(auVar167),ZEXT1632(auVar54));
        auVar93 = vhaddps_avx(ZEXT1632(auVar356),ZEXT1632(auVar75));
        auVar246 = vhaddps_avx(auVar246,auVar93);
        auVar356 = vunpcklps_avx(auVar53,auVar118);
        auVar75 = vunpcklps_avx(auVar84,auVar134);
        auVar54 = vunpckhps_avx(auVar53,auVar118);
        auVar53 = vunpckhps_avx(auVar84,auVar134);
        auVar167 = vmovlhps_avx(auVar356,auVar75);
        auVar75 = vunpckhpd_avx(auVar356,auVar75);
        auVar356 = vmovlhps_avx(auVar54,auVar53);
        auVar53 = vunpckhpd_avx(auVar54,auVar53);
        auVar54._0_4_ =
             auVar75._0_4_ + auVar167._0_4_ + auVar356._0_4_ + auVar53._0_4_ + auVar246._0_4_ +
             auVar246._16_4_ + auVar163._0_4_;
        auVar54._4_4_ =
             auVar75._4_4_ + auVar167._4_4_ + auVar356._4_4_ + auVar53._4_4_ + auVar246._4_4_ +
             auVar246._20_4_ + auVar163._4_4_;
        auVar54._8_4_ =
             auVar75._8_4_ + auVar167._8_4_ + auVar356._8_4_ + auVar53._8_4_ + auVar246._8_4_ +
             auVar246._24_4_ + auVar163._8_4_;
        auVar54._12_4_ =
             auVar75._12_4_ + auVar167._12_4_ + auVar356._12_4_ + auVar53._12_4_ + auVar246._12_4_ +
             auVar246._28_4_ + auVar163._12_4_;
        switch(uVar14) {
        case 1:
          auVar25._12_4_ = 0;
          auVar25._0_12_ = ZEXT412(0);
          auVar54 = vmaxps_avx(auVar54,auVar25 << 0x20);
          break;
        case 2:
          auVar163 = vmaxps_avx(auVar54,ZEXT416(0) << 0x20);
          auVar167 = vminps_avx(auVar54,ZEXT416(0) << 0x20);
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
          auVar58._4_4_ = uVar7;
          auVar58._0_4_ = uVar7;
          auVar58._8_4_ = uVar7;
          auVar58._12_4_ = uVar7;
          auVar54 = vfmadd213ps_fma(auVar58,auVar167,auVar163);
          break;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
          auVar79._4_4_ = uVar7;
          auVar79._0_4_ = uVar7;
          auVar79._8_4_ = uVar7;
          auVar79._12_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var15))[1];
          auVar131._4_4_ = uVar7;
          auVar131._0_4_ = uVar7;
          auVar131._8_4_ = uVar7;
          auVar131._12_4_ = uVar7;
          auVar163 = vmaxps_avx(auVar54,auVar79);
          auVar54 = vminps_avx(auVar163,auVar131);
          break;
        case 4:
          uVar36 = CONCAT44(auVar54._4_4_,auVar54._0_4_);
          auVar55._0_8_ = uVar36 ^ 0x8000000080000000;
          auVar55._8_4_ = -auVar54._8_4_;
          auVar55._12_4_ = -auVar54._12_4_;
          auVar80._8_4_ = 0x42b0c0a5;
          auVar80._0_8_ = 0x42b0c0a542b0c0a5;
          auVar80._12_4_ = 0x42b0c0a5;
          auVar163 = vminps_avx(auVar55,auVar80);
          auVar81._8_4_ = 0xc2b0c0a5;
          auVar81._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar81._12_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar163,auVar81);
          auVar82._8_4_ = 0x3fb8aa3b;
          auVar82._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar82._12_4_ = 0x3fb8aa3b;
          auVar132._8_4_ = 0x3f000000;
          auVar132._0_8_ = 0x3f0000003f000000;
          auVar132._12_4_ = 0x3f000000;
          auVar163 = vfmadd213ps_fma(auVar82,auVar54,auVar132);
          auVar178._0_4_ = (int)auVar163._0_4_;
          auVar178._4_4_ = (int)auVar163._4_4_;
          auVar178._8_4_ = (int)auVar163._8_4_;
          auVar178._12_4_ = (int)auVar163._12_4_;
          auVar167 = vcvtdq2ps_avx(auVar178);
          auVar163 = vcmpps_avx(auVar163,auVar167,1);
          auVar83._8_4_ = 0x3f800000;
          auVar83._0_8_ = 0x3f8000003f800000;
          auVar83._12_4_ = 0x3f800000;
          auVar163 = vandps_avx(auVar163,auVar83);
          auVar163 = vsubps_avx(auVar167,auVar163);
          auVar219._8_4_ = 0x3f318000;
          auVar219._0_8_ = 0x3f3180003f318000;
          auVar219._12_4_ = 0x3f318000;
          auVar167 = vfmsub213ps_fma(auVar219,auVar163,auVar54);
          auVar56._8_4_ = 0x395e8083;
          auVar56._0_8_ = 0x395e8083395e8083;
          auVar56._12_4_ = 0x395e8083;
          auVar54 = vfmsub213ps_fma(auVar56,auVar163,auVar167);
          auVar220._0_4_ = auVar54._0_4_ * auVar54._0_4_;
          auVar220._4_4_ = auVar54._4_4_ * auVar54._4_4_;
          auVar220._8_4_ = auVar54._8_4_ * auVar54._8_4_;
          auVar220._12_4_ = auVar54._12_4_ * auVar54._12_4_;
          auVar231._8_4_ = 0x3ab743ce;
          auVar231._0_8_ = 0x3ab743ce3ab743ce;
          auVar231._12_4_ = 0x3ab743ce;
          auVar243._8_4_ = 0x39506967;
          auVar243._0_8_ = 0x3950696739506967;
          auVar243._12_4_ = 0x39506967;
          auVar167 = vfmadd213ps_fma(auVar243,auVar54,auVar231);
          auVar232._8_4_ = 0x3c088908;
          auVar232._0_8_ = 0x3c0889083c088908;
          auVar232._12_4_ = 0x3c088908;
          auVar167 = vfmadd231ps_fma(auVar232,auVar54,auVar167);
          auVar244._8_4_ = 0x3d2aa9c1;
          auVar244._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar244._12_4_ = 0x3d2aa9c1;
          auVar167 = vfmadd231ps_fma(auVar244,auVar54,auVar167);
          auVar233._8_4_ = 0x3e2aaaaa;
          auVar233._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar233._12_4_ = 0x3e2aaaaa;
          auVar167 = vfmadd231ps_fma(auVar233,auVar54,auVar167);
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar132);
          auVar167 = vfmadd213ps_fma(auVar167,auVar220,auVar54);
          auVar133._0_4_ = auVar167._0_4_ + 1.0;
          auVar133._4_4_ = auVar167._4_4_ + 1.0;
          auVar133._8_4_ = auVar167._8_4_ + 1.0;
          auVar133._12_4_ = auVar167._12_4_ + 1.0;
          auVar57._0_4_ = (int)auVar163._0_4_;
          auVar57._4_4_ = (int)auVar163._4_4_;
          auVar57._8_4_ = (int)auVar163._8_4_;
          auVar57._12_4_ = (int)auVar163._12_4_;
          auVar163 = vpslld_avx(auVar57,0x17);
          auVar163 = vpaddd_avx(auVar163,auVar83);
          auVar167 = vfmadd213ps_fma(auVar163,auVar133,auVar83);
          auVar163 = vrcpps_avx(auVar167);
          auVar167 = vfmsub213ps_fma(auVar167,auVar163,auVar83);
          auVar54 = vfnmadd132ps_fma(auVar167,auVar163,auVar163);
          break;
        case 5:
          auVar76._8_4_ = 0x42b0c0a5;
          auVar76._0_8_ = 0x42b0c0a542b0c0a5;
          auVar76._12_4_ = 0x42b0c0a5;
          auVar105 = vminps_avx(auVar54,auVar76);
          auVar119._8_4_ = 0xc2b0c0a5;
          auVar119._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar119._12_4_ = 0xc2b0c0a5;
          auVar167 = vmaxps_avx(auVar105,auVar119);
          auVar230._8_4_ = 0x3fb8aa3b;
          auVar230._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar230._12_4_ = 0x3fb8aa3b;
          auVar254._8_4_ = 0x3f000000;
          auVar254._0_8_ = 0x3f0000003f000000;
          auVar254._12_4_ = 0x3f000000;
          auVar105 = vfmadd213ps_fma(auVar230,auVar167,auVar254);
          auVar175._0_4_ = (int)auVar105._0_4_;
          auVar175._4_4_ = (int)auVar105._4_4_;
          auVar175._8_4_ = (int)auVar105._8_4_;
          auVar175._12_4_ = (int)auVar105._12_4_;
          auVar163 = vcvtdq2ps_avx(auVar175);
          auVar105 = vcmpps_avx(auVar105,auVar163,1);
          auVar242._8_4_ = 0x3f800000;
          auVar242._0_8_ = 0x3f8000003f800000;
          auVar242._12_4_ = 0x3f800000;
          auVar105 = vandps_avx(auVar105,auVar242);
          auVar163 = vsubps_avx(auVar163,auVar105);
          auVar176._8_4_ = 0x3f318000;
          auVar176._0_8_ = 0x3f3180003f318000;
          auVar176._12_4_ = 0x3f318000;
          auVar105 = vfmsub231ps_fma(auVar167,auVar163,auVar176);
          auVar271._8_4_ = 0xb95e8083;
          auVar271._0_8_ = 0xb95e8083b95e8083;
          auVar271._12_4_ = 0xb95e8083;
          auVar356 = vfnmsub231ps_fma(auVar105,auVar163,auVar271);
          auVar366._0_4_ = auVar356._0_4_ * auVar356._0_4_;
          auVar366._4_4_ = auVar356._4_4_ * auVar356._4_4_;
          auVar366._8_4_ = auVar356._8_4_ * auVar356._8_4_;
          auVar366._12_4_ = auVar356._12_4_ * auVar356._12_4_;
          auVar120._8_4_ = 0x3ab743ce;
          auVar120._0_8_ = 0x3ab743ce3ab743ce;
          auVar120._12_4_ = 0x3ab743ce;
          auVar77._8_4_ = 0x39506967;
          auVar77._0_8_ = 0x3950696739506967;
          auVar77._12_4_ = 0x39506967;
          auVar105 = vfmadd213ps_fma(auVar77,auVar356,auVar120);
          auVar310._8_4_ = 0x3c088908;
          auVar310._0_8_ = 0x3c0889083c088908;
          auVar310._12_4_ = 0x3c088908;
          auVar105 = vfmadd213ps_fma(auVar105,auVar356,auVar310);
          auVar332._8_4_ = 0x3d2aa9c1;
          auVar332._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar332._12_4_ = 0x3d2aa9c1;
          auVar167 = vfmadd213ps_fma(auVar105,auVar356,auVar332);
          auVar105._8_4_ = 0x3e2aaaaa;
          auVar105._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar105._12_4_ = 0x3e2aaaaa;
          auVar167 = vfmadd213ps_fma(auVar167,auVar356,auVar105);
          auVar167 = vfmadd213ps_fma(auVar167,auVar356,auVar254);
          auVar167 = vfmadd213ps_fma(auVar167,auVar366,auVar356);
          auVar207._0_4_ = auVar167._0_4_ + 1.0;
          auVar207._4_4_ = auVar167._4_4_ + 1.0;
          auVar207._8_4_ = auVar167._8_4_ + 1.0;
          auVar207._12_4_ = auVar167._12_4_ + 1.0;
          auVar355._0_4_ = (int)auVar163._0_4_;
          auVar355._4_4_ = (int)auVar163._4_4_;
          auVar355._8_4_ = (int)auVar163._8_4_;
          auVar355._12_4_ = (int)auVar163._12_4_;
          auVar163 = vpslld_avx(auVar355,0x17);
          auVar163 = vpaddd_avx(auVar163,auVar242);
          auVar163 = vfmadd213ps_fma(auVar163,auVar207,auVar242);
          auVar167 = vcmpps_avx(auVar163,ZEXT816(0) << 0x40,2);
          auVar208._8_4_ = 0x800000;
          auVar208._0_8_ = 0x80000000800000;
          auVar208._12_4_ = 0x800000;
          auVar163 = vmaxps_avx(auVar163,auVar208);
          auVar356 = vpsrld_avx(auVar163,0x17);
          auVar367._8_4_ = 0x807fffff;
          auVar367._0_8_ = 0x807fffff807fffff;
          auVar367._12_4_ = 0x807fffff;
          auVar163 = vandps_avx(auVar367,auVar163);
          auVar75 = vorps_avx(auVar163,auVar254);
          auVar368._8_4_ = 0xffffff82;
          auVar368._0_8_ = 0xffffff82ffffff82;
          auVar368._12_4_ = 0xffffff82;
          auVar53 = vpaddd_avx(auVar356,auVar368);
          auVar357._8_4_ = 0x3f3504f3;
          auVar357._0_8_ = 0x3f3504f33f3504f3;
          auVar357._12_4_ = 0x3f3504f3;
          auVar356 = vcmpps_avx(auVar75,auVar357,1);
          auVar163 = vandps_avx(auVar356,auVar75);
          auVar358._0_4_ = auVar75._0_4_ + -1.0 + auVar163._0_4_;
          auVar358._4_4_ = auVar75._4_4_ + -1.0 + auVar163._4_4_;
          auVar358._8_4_ = auVar75._8_4_ + -1.0 + auVar163._8_4_;
          auVar358._12_4_ = auVar75._12_4_ + -1.0 + auVar163._12_4_;
          auVar75 = vcvtdq2ps_avx(auVar53);
          auVar163 = vandps_avx(auVar356,auVar242);
          auVar163 = vsubps_avx(auVar75,auVar163);
          auVar121._8_4_ = 0xbdebd1b8;
          auVar121._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar121._12_4_ = 0xbdebd1b8;
          auVar209._8_4_ = 0x3d9021bb;
          auVar209._0_8_ = 0x3d9021bb3d9021bb;
          auVar209._12_4_ = 0x3d9021bb;
          auVar356 = vfmadd213ps_fma(auVar209,auVar358,auVar121);
          auVar122._8_4_ = 0x3def251a;
          auVar122._0_8_ = 0x3def251a3def251a;
          auVar122._12_4_ = 0x3def251a;
          auVar356 = vfmadd231ps_fma(auVar122,auVar358,auVar356);
          auVar210._8_4_ = 0xbdfe5d4f;
          auVar210._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar210._12_4_ = 0xbdfe5d4f;
          auVar356 = vfmadd231ps_fma(auVar210,auVar358,auVar356);
          auVar123._8_4_ = 0x3e11e9bf;
          auVar123._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar123._12_4_ = 0x3e11e9bf;
          auVar356 = vfmadd231ps_fma(auVar123,auVar358,auVar356);
          auVar211._8_4_ = 0xbe2aae50;
          auVar211._0_8_ = 0xbe2aae50be2aae50;
          auVar211._12_4_ = 0xbe2aae50;
          auVar356 = vfmadd231ps_fma(auVar211,auVar358,auVar356);
          auVar124._8_4_ = 0x3e4cceac;
          auVar124._0_8_ = 0x3e4cceac3e4cceac;
          auVar124._12_4_ = 0x3e4cceac;
          auVar356 = vfmadd231ps_fma(auVar124,auVar358,auVar356);
          auVar212._8_4_ = 0xbe7ffffc;
          auVar212._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar212._12_4_ = 0xbe7ffffc;
          auVar356 = vfmadd231ps_fma(auVar212,auVar358,auVar356);
          auVar125._8_4_ = 0x3eaaaaaa;
          auVar125._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar125._12_4_ = 0x3eaaaaaa;
          auVar356 = vfmadd231ps_fma(auVar125,auVar358,auVar356);
          auVar213._0_4_ = auVar358._0_4_ * auVar358._0_4_;
          auVar213._4_4_ = auVar358._4_4_ * auVar358._4_4_;
          auVar213._8_4_ = auVar358._8_4_ * auVar358._8_4_;
          auVar213._12_4_ = auVar358._12_4_ * auVar358._12_4_;
          auVar126._0_4_ = auVar358._0_4_ * auVar213._0_4_ * auVar356._0_4_;
          auVar126._4_4_ = auVar358._4_4_ * auVar213._4_4_ * auVar356._4_4_;
          auVar126._8_4_ = auVar358._8_4_ * auVar213._8_4_ * auVar356._8_4_;
          auVar126._12_4_ = auVar358._12_4_ * auVar213._12_4_ * auVar356._12_4_;
          auVar356 = vfmadd231ps_fma(auVar126,auVar163,auVar271);
          auVar356 = vfmsub231ps_fma(auVar356,auVar254,auVar213);
          auVar356 = vsubps_avx(auVar356,auVar358);
          auVar163 = vfnmadd231ps_fma(auVar356,auVar176,auVar163);
          auVar127._0_4_ = auVar163._0_4_ + auVar163._0_4_;
          auVar127._4_4_ = auVar163._4_4_ + auVar163._4_4_;
          auVar127._8_4_ = auVar163._8_4_ + auVar163._8_4_;
          auVar127._12_4_ = auVar163._12_4_ + auVar163._12_4_;
          auVar214._8_4_ = 0x7fffffff;
          auVar214._0_8_ = 0x7fffffff7fffffff;
          auVar214._12_4_ = 0x7fffffff;
          auVar163 = vblendvps_avx(auVar127,auVar214,auVar167);
          auVar215._8_4_ = 0x42b0c0a5;
          auVar215._0_8_ = 0x42b0c0a542b0c0a5;
          auVar215._12_4_ = 0x42b0c0a5;
          auVar163 = vminps_avx(auVar163,auVar215);
          auVar216._8_4_ = 0xc2b0c0a5;
          auVar216._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar216._12_4_ = 0xc2b0c0a5;
          auVar356 = vmaxps_avx(auVar163,auVar216);
          auVar163 = vfmadd213ps_fma(auVar230,auVar356,auVar254);
          auVar217._0_4_ = (int)auVar163._0_4_;
          auVar217._4_4_ = (int)auVar163._4_4_;
          auVar217._8_4_ = (int)auVar163._8_4_;
          auVar217._12_4_ = (int)auVar163._12_4_;
          auVar167 = vcvtdq2ps_avx(auVar217);
          auVar163 = vcmpps_avx(auVar163,auVar167,1);
          auVar163 = vandps_avx(auVar163,auVar242);
          auVar163 = vsubps_avx(auVar167,auVar163);
          auVar167 = vfmsub213ps_fma(auVar176,auVar163,auVar356);
          auVar356 = vfnmsub231ps_fma(auVar167,auVar163,auVar271);
          auVar128._8_4_ = 0x3ab743ce;
          auVar128._0_8_ = 0x3ab743ce3ab743ce;
          auVar128._12_4_ = 0x3ab743ce;
          auVar167 = vfmadd213ps_fma(auVar77,auVar356,auVar128);
          auVar167 = vfmadd213ps_fma(auVar167,auVar356,auVar310);
          auVar167 = vfmadd213ps_fma(auVar167,auVar356,auVar332);
          auVar167 = vfmadd213ps_fma(auVar167,auVar356,auVar105);
          auVar167 = vfmadd213ps_fma(auVar167,auVar356,auVar254);
          auVar129._0_4_ = auVar356._0_4_ * auVar356._0_4_;
          auVar129._4_4_ = auVar356._4_4_ * auVar356._4_4_;
          auVar129._8_4_ = auVar356._8_4_ * auVar356._8_4_;
          auVar129._12_4_ = auVar356._12_4_ * auVar356._12_4_;
          auVar167 = vfmadd213ps_fma(auVar167,auVar129,auVar356);
          auVar78._0_4_ = auVar167._0_4_ + 1.0;
          auVar78._4_4_ = auVar167._4_4_ + 1.0;
          auVar78._8_4_ = auVar167._8_4_ + 1.0;
          auVar78._12_4_ = auVar167._12_4_ + 1.0;
          auVar130._0_4_ = (int)auVar163._0_4_;
          auVar130._4_4_ = (int)auVar163._4_4_;
          auVar130._8_4_ = (int)auVar163._8_4_;
          auVar130._12_4_ = (int)auVar163._12_4_;
          auVar163 = vpslld_avx(auVar130,0x17);
          auVar163 = vpaddd_avx(auVar163,auVar242);
          auVar167 = vfmadd213ps_fma(auVar163,auVar78,auVar242);
          auVar163 = vrcpps_avx(auVar167);
          auVar177._0_4_ = auVar163._0_4_ + auVar163._0_4_;
          auVar177._4_4_ = auVar163._4_4_ + auVar163._4_4_;
          auVar177._8_4_ = auVar163._8_4_ + auVar163._8_4_;
          auVar177._12_4_ = auVar163._12_4_ + auVar163._12_4_;
          auVar218._8_4_ = 0x40000000;
          auVar218._0_8_ = 0x4000000040000000;
          auVar218._12_4_ = 0x40000000;
          auVar167 = vfmsub231ps_fma(auVar218,auVar177,auVar167);
          auVar163 = vfnmadd213ps_fma(auVar167,auVar163,auVar177);
          auVar54 = vfmsub231ps_fma(auVar54,auVar54,auVar163);
          break;
        case 6:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
          auVar84._4_4_ = uVar7;
          auVar84._0_4_ = uVar7;
          auVar84._8_4_ = uVar7;
          auVar84._12_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var15))[1];
          auVar134._4_4_ = uVar7;
          auVar134._0_4_ = uVar7;
          auVar134._8_4_ = uVar7;
          auVar134._12_4_ = uVar7;
          auVar163 = vfmadd231ps_fma(auVar134,auVar54,auVar84);
          auVar163 = vmaxps_avx(auVar163,ZEXT416(0) << 0x20);
          auVar135._8_4_ = 0x3f800000;
          auVar135._0_8_ = 0x3f8000003f800000;
          auVar135._12_4_ = 0x3f800000;
          auVar163 = vminps_avx(auVar163,auVar135);
          auVar54._0_4_ = auVar163._0_4_ * auVar54._0_4_;
          auVar54._4_4_ = auVar163._4_4_ * auVar54._4_4_;
          auVar54._8_4_ = auVar163._8_4_ * auVar54._8_4_;
          auVar54._12_4_ = auVar163._12_4_ * auVar54._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar29 * 4) = auVar54;
      }
      iVar27 = 0;
      iVar33 = (int)uVar29 + (uVar28 >> 2 & 1) * 4;
      if ((int)uVar28 <= iVar33) goto LAB_002cf3fb;
      pvVar31 = (this->weight_data_tm).data;
      pfVar19 = *(float **)(&this->field_0xe8 + (long)p_Var15);
      pvVar18 = top_blob->data;
      local_160 = uVar46 & 0xfffffff8;
      uVar29 = (ulong)iVar33;
      auVar101 = ZEXT3264(_DAT_00555100);
      auVar161 = ZEXT3264(_DAT_00555120);
      auVar369._8_8_ = 0x8000000000000000;
      auVar369._0_8_ = 0x8000000000000000;
      auVar105 = vpcmpeqd_avx(auVar105,auVar105);
      auVar252 = ZEXT1664(auVar105);
      do {
        auVar105 = ZEXT816(0) << 0x40;
        if (lVar17 != 0) {
          auVar105 = ZEXT416(*(uint *)(lVar17 + uVar29 * 4));
        }
        pauVar34 = (undefined1 (*) [32])((long)pvVar31 + uVar29 * lVar39 * 4);
        pauVar30 = (undefined1 (*) [32])uVar26;
        if ((int)uVar46 < 8) {
          auVar246 = SUB6432(ZEXT864(0),0);
          uVar43 = 0;
        }
        else {
          auVar197 = ZEXT864(0);
          iVar27 = 7;
          do {
            auVar163 = vfmadd231ps_fma(auVar197._0_32_,*pauVar30,*pauVar34);
            auVar197 = ZEXT1664(auVar163);
            auVar246 = ZEXT1632(auVar163);
            pauVar30 = pauVar30 + 1;
            pauVar34 = pauVar34 + 1;
            iVar27 = iVar27 + 8;
            uVar43 = local_160;
          } while (iVar27 < (int)uVar46);
        }
        auVar163 = ZEXT816(0) << 0x40;
        uVar41 = uVar43 | 3;
        while ((int)uVar41 < (int)uVar46) {
          auVar163 = vfmadd231ps_fma(auVar163,*(undefined1 (*) [16])*pauVar30,
                                     *(undefined1 (*) [16])*pauVar34);
          pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
          pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
          uVar41 = uVar43 + 7;
          uVar43 = uVar43 + 4;
        }
        if ((int)uVar43 < (int)uVar46) {
          uVar36 = CONCAT44(0,~uVar43 + uVar46);
          auVar105 = vblendps_avx(auVar105,_DAT_00552030,0xe);
          auVar179._8_8_ = 0;
          auVar179._0_8_ = uVar36;
          auVar356 = vpshufd_avx(auVar179,0x44);
          auVar167 = vorps_avx(auVar369,auVar356);
          auVar54 = vorps_avx(auVar369,auVar356);
          uVar37 = 0;
          do {
            auVar84 = auVar105;
            auVar234._8_8_ = 0;
            auVar234._0_8_ = uVar37;
            auVar105 = vpshufd_avx(auVar234,0x44);
            auVar265._16_16_ = auVar105;
            auVar265._0_16_ = auVar105;
            auVar93 = vorps_avx(auVar101._0_32_,auVar265);
            auVar62 = vorps_avx(auVar161._0_32_,auVar265);
            auVar105 = vorps_avx(auVar356,auVar369);
            auVar272._0_8_ = auVar62._16_8_ ^ 0x8000000000000000;
            auVar272._8_4_ = auVar62._24_4_;
            auVar272._12_4_ = auVar62._28_4_ ^ 0x80000000;
            auVar53 = vpcmpgtq_avx(auVar272,auVar105);
            auVar311._0_8_ = auVar62._0_8_ ^ 0x8000000000000000;
            auVar311._8_4_ = auVar62._8_4_;
            auVar311._12_4_ = auVar62._12_4_ ^ 0x80000000;
            auVar75 = vpcmpgtq_avx(auVar311,auVar167);
            auVar75 = vpackssdw_avx(auVar75,auVar53);
            auVar333._0_8_ = auVar93._16_8_ ^ 0x8000000000000000;
            auVar333._8_4_ = auVar93._24_4_;
            auVar333._12_4_ = auVar93._28_4_ ^ 0x80000000;
            auVar118 = vpcmpgtq_avx(auVar333,auVar105);
            auVar334._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
            auVar334._8_4_ = auVar93._8_4_;
            auVar334._12_4_ = auVar93._12_4_ ^ 0x80000000;
            auVar105 = vpcmpgtq_avx(auVar334,auVar54);
            auVar105 = vpackssdw_avx(auVar105,auVar118);
            auVar105 = vpackssdw_avx(auVar105 ^ auVar252._0_16_,auVar75 ^ auVar252._0_16_);
            auVar75 = vpmovsxwd_avx(auVar105);
            auVar105 = vpunpckhwd_avx(auVar105,auVar105);
            auVar340._16_16_ = auVar105;
            auVar340._0_16_ = auVar75;
            auVar91 = vmaskmovps_avx(auVar340,*(undefined1 (*) [32])(*pauVar30 + uVar37 * 4));
            auVar160 = vmaskmovps_avx(auVar340,*(undefined1 (*) [32])(*pauVar34 + uVar37 * 4));
            auVar105 = vfmadd213ps_fma(auVar160,auVar91,ZEXT1632(auVar84));
            auVar75 = vpcmpeqd_avx(auVar91._0_16_,auVar91._0_16_);
            auVar252 = ZEXT1664(auVar75);
            uVar37 = uVar37 + 8;
          } while ((uVar36 + 8 & 0xfffffffffffffff8) != uVar37);
          auVar167 = vorps_avx(auVar369,auVar356);
          auVar245._0_8_ = auVar62._0_8_ ^ 0x8000000000000000;
          auVar245._8_4_ = auVar62._8_4_;
          auVar245._12_4_ = auVar62._12_4_ ^ 0x80000000;
          auVar167 = vpcmpgtq_avx(auVar245,auVar167);
          auVar54 = vpackssdw_avx(auVar167,auVar53);
          auVar167 = vorps_avx(auVar369,auVar356);
          auVar235._0_8_ = auVar93._0_8_ ^ 0x8000000000000000;
          auVar235._8_4_ = auVar93._8_4_;
          auVar235._12_4_ = auVar93._12_4_ ^ 0x80000000;
          auVar167 = vpcmpgtq_avx(auVar235,auVar167);
          auVar167 = vpackssdw_avx(auVar167,auVar118);
          auVar105 = vblendvps_avx(auVar84,auVar105,auVar75 ^ auVar167);
          auVar167 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar75 ^ auVar54);
          auVar105 = vhaddps_avx(auVar167,auVar105);
          auVar105 = vhaddps_avx(auVar105,auVar105);
          auVar105 = vhaddps_avx(auVar105,auVar105);
        }
        auVar59._0_4_ = auVar246._0_4_ + auVar246._16_4_ + auVar163._0_4_;
        auVar59._4_4_ = auVar246._4_4_ + auVar246._20_4_ + auVar163._4_4_;
        auVar59._8_4_ = auVar246._8_4_ + auVar246._24_4_ + auVar163._8_4_;
        auVar59._12_4_ = auVar246._12_4_ + auVar246._28_4_ + auVar163._12_4_;
        auVar163 = vhaddps_avx(auVar59,auVar59);
        auVar163 = vhaddps_avx(auVar163,auVar163);
        fVar103 = auVar163._0_4_ + auVar105._0_4_;
        auVar105 = ZEXT416((uint)fVar103);
        auVar163 = auVar252._0_16_;
        fVar66 = fVar103;
        switch(uVar14) {
        case 1:
          auVar105 = vmaxss_avx(auVar105,ZEXT416(0));
          fVar66 = auVar105._0_4_;
          break;
        case 2:
          auVar105 = vcmpss_avx(ZEXT816(0) << 0x20,auVar105,1);
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = 0x3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar105 = vblendvps_avx(ZEXT416((uint)*pfVar19),auVar137,auVar105);
          fVar66 = auVar105._0_4_ * fVar103;
          break;
        case 3:
          auVar105 = vmaxss_avx(auVar105,ZEXT416((uint)*pfVar19));
          fVar66 = auVar105._0_4_;
          if (pfVar19[1] < auVar105._0_4_) {
            fVar66 = pfVar19[1];
          }
          break;
        case 4:
          auVar105 = vminss_avx(auVar105,ZEXT416(0x42b0c0a5));
          auVar85._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
          auVar85._8_4_ = auVar105._8_4_ ^ 0x80000000;
          auVar85._12_4_ = auVar105._12_4_ ^ 0x80000000;
          auVar105 = vcmpss_avx(auVar105,ZEXT416(0xc2b0c0a5),1);
          auVar136._8_4_ = 0x42b0c0a5;
          auVar136._0_8_ = 0x42b0c0a542b0c0a5;
          auVar136._12_4_ = 0x42b0c0a5;
          auVar105 = vblendvps_avx(auVar85,auVar136,auVar105);
          fVar103 = expf(auVar105._0_4_);
          auVar105 = vpcmpeqd_avx(auVar163,auVar163);
          auVar252 = ZEXT1664(auVar105);
          auVar161 = ZEXT3264(_DAT_00555120);
          auVar101 = ZEXT3264(_DAT_00555100);
          fVar66 = 1.0 / (fVar103 + 1.0);
          break;
        case 5:
          fVar66 = expf(fVar103);
          fVar66 = logf(fVar66 + 1.0);
          fVar66 = tanhf(fVar66);
          auVar105 = vpcmpeqd_avx(auVar163,auVar163);
          auVar252 = ZEXT1664(auVar105);
          auVar161 = ZEXT3264(_DAT_00555120);
          auVar101 = ZEXT3264(_DAT_00555100);
          fVar66 = fVar66 * fVar103;
          break;
        case 6:
          fVar306 = *pfVar19;
          fVar162 = -pfVar19[1] / fVar306;
          fVar66 = 0.0;
          if ((fVar162 <= fVar103) && (fVar66 = fVar103, fVar103 <= fVar162 + 1.0 / fVar306)) {
            auVar105 = vfmadd213ss_fma(ZEXT416((uint)fVar306),auVar105,ZEXT416((uint)pfVar19[1]));
            fVar66 = auVar105._0_4_ * fVar103;
          }
        }
        *(float *)((long)pvVar18 + uVar29 * 4) = fVar66;
        uVar29 = uVar29 + 1;
      } while (uVar29 != (long)(int)uVar28);
    }
    else if (iVar33 == 4) {
      iVar27 = 0;
      if ((int)uVar28 < 1) goto LAB_002cf3fb;
      uVar29 = 0;
      auVar229._8_4_ = 0x3f000000;
      auVar229._0_8_ = 0x3f0000003f000000;
      auVar229._12_4_ = 0x3f000000;
      auVar252 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar354._8_4_ = 0x3ab743ce;
      auVar354._0_8_ = 0x3ab743ce3ab743ce;
      auVar354._12_4_ = 0x3ab743ce;
      auVar308._8_4_ = 0x3c088908;
      auVar308._0_8_ = 0x3c0889083c088908;
      auVar308._12_4_ = 0x3c088908;
      auVar253._8_4_ = 0x3d2aa9c1;
      auVar253._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar253._12_4_ = 0x3d2aa9c1;
      do {
        auVar105 = ZEXT816(0) << 0x40;
        if (lVar17 != 0) {
          auVar105 = *(undefined1 (*) [16])(lVar17 + uVar29 * 0x10);
        }
        pauVar34 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar29 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        pauVar30 = (undefined1 (*) [32])local_f8._0_8_;
        if ((int)uVar46 < 8) {
          auVar93 = SUB6432(ZEXT864(0),0);
          auVar246 = SUB6432(ZEXT864(0),0);
          auVar161 = ZEXT864(0);
          auVar101 = ZEXT864(0);
          uVar43 = 0;
        }
        else {
          auVar101 = ZEXT864(0);
          iVar27 = 7;
          auVar161 = ZEXT864(0);
          auVar197 = ZEXT864(0);
          auVar373 = ZEXT864(0);
          do {
            uVar7 = *(undefined4 *)*pauVar30;
            auVar223._4_4_ = uVar7;
            auVar223._0_4_ = uVar7;
            auVar223._8_4_ = uVar7;
            auVar223._12_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 4);
            auVar223._20_4_ = uVar7;
            auVar223._16_4_ = uVar7;
            auVar223._24_4_ = uVar7;
            auVar223._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 8);
            auVar293._4_4_ = uVar7;
            auVar293._0_4_ = uVar7;
            auVar293._8_4_ = uVar7;
            auVar293._12_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 0xc);
            auVar293._20_4_ = uVar7;
            auVar293._16_4_ = uVar7;
            auVar293._24_4_ = uVar7;
            auVar293._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 0x10);
            auVar337._4_4_ = uVar7;
            auVar337._0_4_ = uVar7;
            auVar337._8_4_ = uVar7;
            auVar337._12_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 0x14);
            auVar337._20_4_ = uVar7;
            auVar337._16_4_ = uVar7;
            auVar337._24_4_ = uVar7;
            auVar337._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 0x18);
            auVar345._4_4_ = uVar7;
            auVar345._0_4_ = uVar7;
            auVar345._8_4_ = uVar7;
            auVar345._12_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 0x1c);
            auVar345._20_4_ = uVar7;
            auVar345._16_4_ = uVar7;
            auVar345._24_4_ = uVar7;
            auVar345._28_4_ = uVar7;
            auVar163 = vfmadd231ps_fma(auVar101._0_32_,auVar223,*pauVar34);
            auVar101 = ZEXT1664(auVar163);
            auVar163 = vfmadd231ps_fma(auVar161._0_32_,auVar293,pauVar34[1]);
            auVar161 = ZEXT1664(auVar163);
            auVar163 = vfmadd231ps_fma(auVar197._0_32_,auVar337,pauVar34[2]);
            auVar197 = ZEXT1664(auVar163);
            auVar246 = ZEXT1632(auVar163);
            auVar163 = vfmadd231ps_fma(auVar373._0_32_,auVar345,pauVar34[3]);
            auVar373 = ZEXT1664(auVar163);
            auVar93 = ZEXT1632(auVar163);
            pauVar30 = pauVar30 + 1;
            pauVar34 = pauVar34 + 4;
            iVar27 = iVar27 + 8;
            uVar43 = uVar46 & 0xfffffff8;
          } while (iVar27 < (int)uVar46);
        }
        auVar91 = auVar101._0_32_;
        auVar62 = auVar161._0_32_;
        uVar41 = uVar43 | 3;
        while ((int)uVar41 < (int)uVar46) {
          uVar7 = *(undefined4 *)*pauVar30;
          auVar224._4_4_ = uVar7;
          auVar224._0_4_ = uVar7;
          auVar224._8_4_ = uVar7;
          auVar224._12_4_ = uVar7;
          uVar7 = *(undefined4 *)(*pauVar30 + 4);
          auVar224._20_4_ = uVar7;
          auVar224._16_4_ = uVar7;
          auVar224._24_4_ = uVar7;
          auVar224._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(*pauVar30 + 8);
          auVar294._4_4_ = uVar7;
          auVar294._0_4_ = uVar7;
          auVar294._8_4_ = uVar7;
          auVar294._12_4_ = uVar7;
          uVar7 = *(undefined4 *)(*pauVar30 + 0xc);
          auVar294._20_4_ = uVar7;
          auVar294._16_4_ = uVar7;
          auVar294._24_4_ = uVar7;
          auVar294._28_4_ = uVar7;
          auVar163 = vfmadd231ps_fma(auVar101._0_32_,auVar224,*pauVar34);
          auVar101 = ZEXT1664(auVar163);
          auVar91 = ZEXT1632(auVar163);
          auVar163 = vfmadd231ps_fma(auVar161._0_32_,auVar294,pauVar34[1]);
          auVar161 = ZEXT1664(auVar163);
          auVar62 = ZEXT1632(auVar163);
          pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
          pauVar34 = pauVar34 + 2;
          uVar41 = uVar43 + 7;
          uVar43 = uVar43 + 4;
        }
        if (uVar46 - uVar43 != 0 && (int)uVar43 <= (int)uVar46) {
          lVar39 = 0;
          do {
            uVar7 = *(undefined4 *)(*pauVar30 + lVar39 * 4);
            auVar199._4_4_ = uVar7;
            auVar199._0_4_ = uVar7;
            auVar199._8_4_ = uVar7;
            auVar199._12_4_ = uVar7;
            auVar105 = vfmadd231ps_fma(auVar105,auVar199,*(undefined1 (*) [16])*pauVar34);
            pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
            lVar39 = lVar39 + 1;
          } while (uVar46 - uVar43 != (int)lVar39);
        }
        fVar103 = auVar93._4_4_ + auVar246._4_4_ + auVar62._4_4_ + auVar91._4_4_;
        auVar364._0_4_ =
             auVar105._0_4_ +
             auVar93._16_4_ + auVar246._16_4_ + auVar62._16_4_ + auVar91._16_4_ +
             auVar93._0_4_ + auVar246._0_4_ + auVar62._0_4_ + auVar91._0_4_;
        auVar364._4_4_ = auVar105._4_4_ + fVar103 + fVar103;
        auVar364._8_4_ =
             auVar105._8_4_ +
             auVar93._24_4_ + auVar246._24_4_ + auVar62._24_4_ + auVar91._24_4_ +
             auVar93._8_4_ + auVar246._8_4_ + auVar62._8_4_ + auVar91._8_4_;
        auVar364._12_4_ =
             auVar105._12_4_ +
             auVar93._28_4_ + auVar246._28_4_ + auVar62._28_4_ + auVar91._28_4_ +
             auVar93._12_4_ + auVar246._12_4_ + auVar62._12_4_ + auVar91._12_4_;
        auVar105 = auVar252._0_16_;
        fVar103 = auVar252._0_4_;
        fVar66 = auVar252._4_4_;
        fVar306 = auVar252._8_4_;
        fVar162 = auVar252._12_4_;
        switch(uVar14) {
        case 1:
          auVar364 = vmaxps_avx(auVar364,_DAT_00552030);
          break;
        case 2:
          auVar105 = vmaxps_avx(auVar364,ZEXT816(0) << 0x40);
          auVar163 = vminps_avx(auVar364,ZEXT816(0) << 0x40);
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
          auVar365._4_4_ = uVar7;
          auVar365._0_4_ = uVar7;
          auVar365._8_4_ = uVar7;
          auVar365._12_4_ = uVar7;
          auVar364 = vfmadd213ps_fma(auVar365,auVar163,auVar105);
          break;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
          auVar71._4_4_ = uVar7;
          auVar71._0_4_ = uVar7;
          auVar71._8_4_ = uVar7;
          auVar71._12_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var15))[1];
          auVar112._4_4_ = uVar7;
          auVar112._0_4_ = uVar7;
          auVar112._8_4_ = uVar7;
          auVar112._12_4_ = uVar7;
          auVar105 = vmaxps_avx(auVar364,auVar71);
          auVar364 = vminps_avx(auVar105,auVar112);
          break;
        case 4:
          uVar36 = CONCAT44(auVar364._4_4_,auVar364._0_4_);
          auVar72._0_8_ = uVar36 ^ 0x8000000080000000;
          auVar72._8_4_ = -auVar364._8_4_;
          auVar72._12_4_ = -auVar364._12_4_;
          auVar113._8_4_ = 0x42b0c0a5;
          auVar113._0_8_ = 0x42b0c0a542b0c0a5;
          auVar113._12_4_ = 0x42b0c0a5;
          auVar163 = vminps_avx(auVar72,auVar113);
          auVar114._8_4_ = 0xc2b0c0a5;
          auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar114._12_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar163,auVar114);
          auVar115._8_4_ = 0x3fb8aa3b;
          auVar115._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar115._12_4_ = 0x3fb8aa3b;
          auVar163 = vfmadd213ps_fma(auVar115,auVar54,auVar229);
          auVar172._0_4_ = (int)auVar163._0_4_;
          auVar172._4_4_ = (int)auVar163._4_4_;
          auVar172._8_4_ = (int)auVar163._8_4_;
          auVar172._12_4_ = (int)auVar163._12_4_;
          auVar167 = vcvtdq2ps_avx(auVar172);
          auVar163 = vcmpps_avx(auVar163,auVar167,1);
          auVar163 = vandps_avx(auVar163,auVar105);
          auVar163 = vsubps_avx(auVar167,auVar163);
          auVar50._8_4_ = 0x3f318000;
          auVar50._0_8_ = 0x3f3180003f318000;
          auVar50._12_4_ = 0x3f318000;
          auVar167 = vfmsub231ps_fma(auVar54,auVar163,auVar50);
          auVar173._8_4_ = 0x395e8083;
          auVar173._0_8_ = 0x395e8083395e8083;
          auVar173._12_4_ = 0x395e8083;
          auVar54 = vfmsub231ps_fma(auVar167,auVar163,auVar173);
          auVar174._0_4_ = auVar54._0_4_ * auVar54._0_4_;
          auVar174._4_4_ = auVar54._4_4_ * auVar54._4_4_;
          auVar174._8_4_ = auVar54._8_4_ * auVar54._8_4_;
          auVar174._12_4_ = auVar54._12_4_ * auVar54._12_4_;
          auVar206._8_4_ = 0x39506967;
          auVar206._0_8_ = 0x3950696739506967;
          auVar206._12_4_ = 0x39506967;
          auVar269._8_4_ = 0x3ab743ce;
          auVar269._0_8_ = 0x3ab743ce3ab743ce;
          auVar269._12_4_ = 0x3ab743ce;
          auVar167 = vfmadd213ps_fma(auVar206,auVar54,auVar269);
          auVar270._8_4_ = 0x3c088908;
          auVar270._0_8_ = 0x3c0889083c088908;
          auVar270._12_4_ = 0x3c088908;
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar270);
          auVar51._8_4_ = 0x3d2aa9c1;
          auVar51._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar51._12_4_ = 0x3d2aa9c1;
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar51);
          auVar52._8_4_ = 0x3e2aaaaa;
          auVar52._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar52._12_4_ = 0x3e2aaaaa;
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar52);
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar229);
          auVar167 = vfmadd213ps_fma(auVar167,auVar174,auVar54);
          auVar73._0_4_ = auVar167._0_4_ + fVar103;
          auVar73._4_4_ = auVar167._4_4_ + fVar66;
          auVar73._8_4_ = auVar167._8_4_ + fVar306;
          auVar73._12_4_ = auVar167._12_4_ + fVar162;
          auVar116._0_4_ = (int)auVar163._0_4_;
          auVar116._4_4_ = (int)auVar163._4_4_;
          auVar116._8_4_ = (int)auVar163._8_4_;
          auVar116._12_4_ = (int)auVar163._12_4_;
          auVar163 = vpslld_avx(auVar116,0x17);
          auVar163 = vpaddd_avx(auVar163,auVar105);
          auVar167 = vfmadd213ps_fma(auVar163,auVar73,auVar105);
          auVar163 = vrcpps_avx(auVar167);
          auVar105 = vfmsub213ps_fma(auVar167,auVar163,auVar105);
          auVar364 = vfnmadd132ps_fma(auVar105,auVar163,auVar163);
          break;
        case 5:
          auVar330._8_4_ = 0x42b0c0a5;
          auVar330._0_8_ = 0x42b0c0a542b0c0a5;
          auVar330._12_4_ = 0x42b0c0a5;
          auVar163 = vminps_avx(auVar364,auVar330);
          auVar342._8_4_ = 0xc2b0c0a5;
          auVar342._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar342._12_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar342,auVar163);
          auVar348._8_4_ = 0x3fb8aa3b;
          auVar348._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar348._12_4_ = 0x3fb8aa3b;
          auVar163 = vfmadd213ps_fma(auVar348,auVar54,auVar229);
          auVar164._0_4_ = (int)auVar163._0_4_;
          auVar164._4_4_ = (int)auVar163._4_4_;
          auVar164._8_4_ = (int)auVar163._8_4_;
          auVar164._12_4_ = (int)auVar163._12_4_;
          auVar167 = vcvtdq2ps_avx(auVar164);
          auVar163 = vcmpps_avx(auVar163,auVar167,1);
          auVar163 = vandps_avx(auVar163,auVar105);
          auVar163 = vsubps_avx(auVar167,auVar163);
          auVar331._8_4_ = 0x3f318000;
          auVar331._0_8_ = 0x3f3180003f318000;
          auVar331._12_4_ = 0x3f318000;
          auVar167 = vfmsub231ps_fma(auVar54,auVar163,auVar331);
          auVar241._8_4_ = 0xb95e8083;
          auVar241._0_8_ = 0xb95e8083b95e8083;
          auVar241._12_4_ = 0xb95e8083;
          auVar54 = vfnmsub231ps_fma(auVar167,auVar163,auVar241);
          auVar165._0_4_ = auVar54._0_4_ * auVar54._0_4_;
          auVar165._4_4_ = auVar54._4_4_ * auVar54._4_4_;
          auVar165._8_4_ = auVar54._8_4_ * auVar54._8_4_;
          auVar165._12_4_ = auVar54._12_4_ * auVar54._12_4_;
          auVar200._8_4_ = 0x39506967;
          auVar200._0_8_ = 0x3950696739506967;
          auVar200._12_4_ = 0x39506967;
          auVar167 = vfmadd213ps_fma(auVar200,auVar54,auVar354);
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar308);
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar253);
          auVar266._8_4_ = 0x3e2aaaaa;
          auVar266._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar266._12_4_ = 0x3e2aaaaa;
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar266);
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar229);
          auVar167 = vfmadd213ps_fma(auVar167,auVar165,auVar54);
          auVar166._0_4_ = auVar167._0_4_ + fVar103;
          auVar166._4_4_ = auVar167._4_4_ + fVar66;
          auVar166._8_4_ = auVar167._8_4_ + fVar306;
          auVar166._12_4_ = auVar167._12_4_ + fVar162;
          auVar69._0_4_ = (int)auVar163._0_4_;
          auVar69._4_4_ = (int)auVar163._4_4_;
          auVar69._8_4_ = (int)auVar163._8_4_;
          auVar69._12_4_ = (int)auVar163._12_4_;
          auVar163 = vpslld_avx(auVar69,0x17);
          auVar163 = vpaddd_avx(auVar163,auVar105);
          auVar75 = vfmadd213ps_fma(auVar163,auVar166,auVar105);
          auVar107._8_4_ = 0x800000;
          auVar107._0_8_ = 0x80000000800000;
          auVar107._12_4_ = 0x800000;
          auVar163 = vmaxps_avx(auVar75,auVar107);
          auVar167 = vpsrld_avx(auVar163,0x17);
          auVar201._8_4_ = 0xffffff82;
          auVar201._0_8_ = 0xffffff82ffffff82;
          auVar201._12_4_ = 0xffffff82;
          auVar167 = vpaddd_avx(auVar167,auVar201);
          auVar202._8_4_ = 0x807fffff;
          auVar202._0_8_ = 0x807fffff807fffff;
          auVar202._12_4_ = 0x807fffff;
          auVar163 = vandps_avx(auVar163,auVar202);
          auVar356 = vorps_avx(auVar163,auVar229);
          auVar54 = vcvtdq2ps_avx(auVar167);
          auVar203._8_4_ = 0x3f3504f3;
          auVar203._0_8_ = 0x3f3504f33f3504f3;
          auVar203._12_4_ = 0x3f3504f3;
          auVar167 = vcmpps_avx(auVar356,auVar203,1);
          auVar163 = vandps_avx(auVar167,auVar356);
          auVar108._0_4_ = auVar163._0_4_ + auVar356._0_4_ + -1.0;
          auVar108._4_4_ = auVar163._4_4_ + auVar356._4_4_ + -1.0;
          auVar108._8_4_ = auVar163._8_4_ + auVar356._8_4_ + -1.0;
          auVar108._12_4_ = auVar163._12_4_ + auVar356._12_4_ + -1.0;
          auVar163 = vandps_avx(auVar167,auVar105);
          auVar167 = vsubps_avx(auVar54,auVar163);
          auVar204._0_4_ = auVar108._0_4_ * auVar108._0_4_;
          auVar204._4_4_ = auVar108._4_4_ * auVar108._4_4_;
          auVar204._8_4_ = auVar108._8_4_ * auVar108._8_4_;
          auVar204._12_4_ = auVar108._12_4_ * auVar108._12_4_;
          auVar267._8_4_ = 0x3d9021bb;
          auVar267._0_8_ = 0x3d9021bb3d9021bb;
          auVar267._12_4_ = 0x3d9021bb;
          auVar280._8_4_ = 0xbdebd1b8;
          auVar280._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar280._12_4_ = 0xbdebd1b8;
          auVar163 = vfmadd213ps_fma(auVar267,auVar108,auVar280);
          auVar281._8_4_ = 0x3def251a;
          auVar281._0_8_ = 0x3def251a3def251a;
          auVar281._12_4_ = 0x3def251a;
          auVar163 = vfmadd213ps_fma(auVar163,auVar108,auVar281);
          auVar282._8_4_ = 0xbdfe5d4f;
          auVar282._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar282._12_4_ = 0xbdfe5d4f;
          auVar163 = vfmadd213ps_fma(auVar163,auVar108,auVar282);
          auVar283._8_4_ = 0x3e11e9bf;
          auVar283._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar283._12_4_ = 0x3e11e9bf;
          auVar163 = vfmadd213ps_fma(auVar163,auVar108,auVar283);
          auVar284._8_4_ = 0xbe2aae50;
          auVar284._0_8_ = 0xbe2aae50be2aae50;
          auVar284._12_4_ = 0xbe2aae50;
          auVar163 = vfmadd213ps_fma(auVar163,auVar108,auVar284);
          auVar285._8_4_ = 0x3e4cceac;
          auVar285._0_8_ = 0x3e4cceac3e4cceac;
          auVar285._12_4_ = 0x3e4cceac;
          auVar163 = vfmadd213ps_fma(auVar163,auVar108,auVar285);
          auVar286._8_4_ = 0xbe7ffffc;
          auVar286._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar286._12_4_ = 0xbe7ffffc;
          auVar163 = vfmadd213ps_fma(auVar163,auVar108,auVar286);
          auVar287._8_4_ = 0x3eaaaaaa;
          auVar287._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar287._12_4_ = 0x3eaaaaaa;
          auVar163 = vfmadd213ps_fma(auVar163,auVar108,auVar287);
          auVar268._0_4_ = auVar204._0_4_ * auVar108._0_4_ * auVar163._0_4_;
          auVar268._4_4_ = auVar204._4_4_ * auVar108._4_4_ * auVar163._4_4_;
          auVar268._8_4_ = auVar204._8_4_ * auVar108._8_4_ * auVar163._8_4_;
          auVar268._12_4_ = auVar204._12_4_ * auVar108._12_4_ * auVar163._12_4_;
          auVar163 = vfmadd231ps_fma(auVar268,auVar167,auVar241);
          auVar54 = vfmsub231ps_fma(auVar163,auVar229,auVar204);
          auVar163 = vcmpps_avx(auVar75,_DAT_00552030,2);
          auVar54 = vsubps_avx(auVar54,auVar108);
          auVar167 = vfnmadd231ps_fma(auVar54,auVar331,auVar167);
          auVar109._0_4_ = auVar167._0_4_ + auVar167._0_4_;
          auVar109._4_4_ = auVar167._4_4_ + auVar167._4_4_;
          auVar109._8_4_ = auVar167._8_4_ + auVar167._8_4_;
          auVar109._12_4_ = auVar167._12_4_ + auVar167._12_4_;
          auVar168._8_4_ = 0x7fffffff;
          auVar168._0_8_ = 0x7fffffff7fffffff;
          auVar168._12_4_ = 0x7fffffff;
          auVar163 = vblendvps_avx(auVar109,auVar168,auVar163);
          auVar110._8_4_ = 0x42b0c0a5;
          auVar110._0_8_ = 0x42b0c0a542b0c0a5;
          auVar110._12_4_ = 0x42b0c0a5;
          auVar163 = vminps_avx(auVar163,auVar110);
          auVar54 = vmaxps_avx(auVar342,auVar163);
          auVar163 = vfmadd213ps_fma(auVar348,auVar54,auVar229);
          auVar169._0_4_ = (int)auVar163._0_4_;
          auVar169._4_4_ = (int)auVar163._4_4_;
          auVar169._8_4_ = (int)auVar163._8_4_;
          auVar169._12_4_ = (int)auVar163._12_4_;
          auVar167 = vcvtdq2ps_avx(auVar169);
          auVar163 = vcmpps_avx(auVar163,auVar167,1);
          auVar163 = vandps_avx(auVar163,auVar105);
          auVar163 = vsubps_avx(auVar167,auVar163);
          auVar167 = vfmsub231ps_fma(auVar54,auVar163,auVar331);
          auVar54 = vfnmsub231ps_fma(auVar167,auVar163,auVar241);
          auVar252 = ZEXT1664(auVar105);
          auVar170._0_4_ = auVar54._0_4_ * auVar54._0_4_;
          auVar170._4_4_ = auVar54._4_4_ * auVar54._4_4_;
          auVar170._8_4_ = auVar54._8_4_ * auVar54._8_4_;
          auVar170._12_4_ = auVar54._12_4_ * auVar54._12_4_;
          auVar205._8_4_ = 0x39506967;
          auVar205._0_8_ = 0x3950696739506967;
          auVar205._12_4_ = 0x39506967;
          auVar167 = vfmadd213ps_fma(auVar205,auVar54,auVar354);
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar308);
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar253);
          auVar48._8_4_ = 0x3e2aaaaa;
          auVar48._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar48._12_4_ = 0x3e2aaaaa;
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar48);
          auVar167 = vfmadd213ps_fma(auVar167,auVar54,auVar229);
          auVar167 = vfmadd213ps_fma(auVar167,auVar170,auVar54);
          auVar70._0_4_ = auVar167._0_4_ + fVar103;
          auVar70._4_4_ = auVar167._4_4_ + fVar66;
          auVar70._8_4_ = auVar167._8_4_ + fVar306;
          auVar70._12_4_ = auVar167._12_4_ + fVar162;
          auVar111._0_4_ = (int)auVar163._0_4_;
          auVar111._4_4_ = (int)auVar163._4_4_;
          auVar111._8_4_ = (int)auVar163._8_4_;
          auVar111._12_4_ = (int)auVar163._12_4_;
          auVar163 = vpslld_avx(auVar111,0x17);
          auVar163 = vpaddd_avx(auVar163,auVar105);
          auVar163 = vfmadd213ps_fma(auVar163,auVar70,auVar105);
          auVar105 = vrcpps_avx(auVar163);
          auVar171._0_4_ = auVar105._0_4_ + auVar105._0_4_;
          auVar171._4_4_ = auVar105._4_4_ + auVar105._4_4_;
          auVar171._8_4_ = auVar105._8_4_ + auVar105._8_4_;
          auVar171._12_4_ = auVar105._12_4_ + auVar105._12_4_;
          auVar49._8_4_ = 0x40000000;
          auVar49._0_8_ = 0x4000000040000000;
          auVar49._12_4_ = 0x40000000;
          auVar163 = vfmsub213ps_fma(auVar163,auVar171,auVar49);
          auVar105 = vfnmadd213ps_fma(auVar163,auVar105,auVar171);
          auVar364 = vfmsub231ps_fma(auVar364,auVar364,auVar105);
          break;
        case 6:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
          auVar74._4_4_ = uVar7;
          auVar74._0_4_ = uVar7;
          auVar74._8_4_ = uVar7;
          auVar74._12_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var15))[1];
          auVar117._4_4_ = uVar7;
          auVar117._0_4_ = uVar7;
          auVar117._8_4_ = uVar7;
          auVar117._12_4_ = uVar7;
          auVar163 = vfmadd231ps_fma(auVar117,auVar364,auVar74);
          auVar163 = vmaxps_avx(auVar163,_DAT_00552030);
          auVar105 = vminps_avx(auVar163,auVar105);
          auVar364._0_4_ = auVar364._0_4_ * auVar105._0_4_;
          auVar364._4_4_ = auVar364._4_4_ * auVar105._4_4_;
          auVar364._8_4_ = auVar364._8_4_ * auVar105._8_4_;
          auVar364._12_4_ = auVar364._12_4_ * auVar105._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar29 * 0x10) = auVar364;
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar28);
    }
    else {
      iVar27 = 0;
      if ((iVar33 != 8) || (iVar27 = 0, (int)uVar28 < 1)) goto LAB_002cf3fb;
      uVar29 = 0;
      auVar273._8_4_ = 0x3f000000;
      auVar273._0_8_ = 0x3f0000003f000000;
      auVar273._12_4_ = 0x3f000000;
      auVar273._16_4_ = 0x3f000000;
      auVar273._20_4_ = 0x3f000000;
      auVar273._24_4_ = 0x3f000000;
      auVar273._28_4_ = 0x3f000000;
      auVar252 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      do {
        auVar101 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar17 != 0) {
          auVar101 = ZEXT3264(*(undefined1 (*) [32])(lVar17 + uVar29 * 0x20));
        }
        pauVar34 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar29 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        pauVar30 = (undefined1 (*) [32])local_f8._0_8_;
        if ((int)uVar46 < 8) {
          auVar93 = SUB6432(ZEXT864(0),0);
          auVar91 = SUB6432(ZEXT864(0),0);
          auVar246 = SUB6432(ZEXT864(0),0);
          auVar62 = SUB6432(ZEXT864(0),0);
          auVar161 = ZEXT864(0);
          auVar197 = ZEXT864(0);
          auVar373 = ZEXT864(0);
          uVar43 = 0;
        }
        else {
          auVar373 = ZEXT864(0);
          iVar27 = 7;
          auVar197 = ZEXT864(0);
          auVar161 = ZEXT864(0);
          auVar341 = ZEXT864(0);
          auVar240 = ZEXT864(0);
          auVar347 = ZEXT864(0);
          auVar305 = ZEXT864(0);
          do {
            uVar7 = *(undefined4 *)*pauVar30;
            auVar349._4_4_ = uVar7;
            auVar349._0_4_ = uVar7;
            auVar349._8_4_ = uVar7;
            auVar349._12_4_ = uVar7;
            auVar349._16_4_ = uVar7;
            auVar349._20_4_ = uVar7;
            auVar349._24_4_ = uVar7;
            auVar349._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 4);
            auVar359._4_4_ = uVar7;
            auVar359._0_4_ = uVar7;
            auVar359._8_4_ = uVar7;
            auVar359._12_4_ = uVar7;
            auVar359._16_4_ = uVar7;
            auVar359._20_4_ = uVar7;
            auVar359._24_4_ = uVar7;
            auVar359._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 8);
            auVar312._4_4_ = uVar7;
            auVar312._0_4_ = uVar7;
            auVar312._8_4_ = uVar7;
            auVar312._12_4_ = uVar7;
            auVar312._16_4_ = uVar7;
            auVar312._20_4_ = uVar7;
            auVar312._24_4_ = uVar7;
            auVar312._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 0xc);
            auVar255._4_4_ = uVar7;
            auVar255._0_4_ = uVar7;
            auVar255._8_4_ = uVar7;
            auVar255._12_4_ = uVar7;
            auVar255._16_4_ = uVar7;
            auVar255._20_4_ = uVar7;
            auVar255._24_4_ = uVar7;
            auVar255._28_4_ = uVar7;
            auVar105 = vfmadd231ps_fma(auVar101._0_32_,auVar349,*pauVar34);
            auVar101 = ZEXT1664(auVar105);
            auVar105 = vfmadd231ps_fma(auVar373._0_32_,auVar359,pauVar34[1]);
            auVar373 = ZEXT1664(auVar105);
            auVar105 = vfmadd231ps_fma(auVar197._0_32_,auVar312,pauVar34[2]);
            auVar197 = ZEXT1664(auVar105);
            auVar105 = vfmadd231ps_fma(auVar161._0_32_,auVar255,pauVar34[3]);
            auVar161 = ZEXT1664(auVar105);
            uVar7 = *(undefined4 *)(*pauVar30 + 0x10);
            auVar256._4_4_ = uVar7;
            auVar256._0_4_ = uVar7;
            auVar256._8_4_ = uVar7;
            auVar256._12_4_ = uVar7;
            auVar256._16_4_ = uVar7;
            auVar256._20_4_ = uVar7;
            auVar256._24_4_ = uVar7;
            auVar256._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 0x14);
            auVar313._4_4_ = uVar7;
            auVar313._0_4_ = uVar7;
            auVar313._8_4_ = uVar7;
            auVar313._12_4_ = uVar7;
            auVar313._16_4_ = uVar7;
            auVar313._20_4_ = uVar7;
            auVar313._24_4_ = uVar7;
            auVar313._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 0x18);
            auVar350._4_4_ = uVar7;
            auVar350._0_4_ = uVar7;
            auVar350._8_4_ = uVar7;
            auVar350._12_4_ = uVar7;
            auVar350._16_4_ = uVar7;
            auVar350._20_4_ = uVar7;
            auVar350._24_4_ = uVar7;
            auVar350._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar30 + 0x1c);
            auVar360._4_4_ = uVar7;
            auVar360._0_4_ = uVar7;
            auVar360._8_4_ = uVar7;
            auVar360._12_4_ = uVar7;
            auVar360._16_4_ = uVar7;
            auVar360._20_4_ = uVar7;
            auVar360._24_4_ = uVar7;
            auVar360._28_4_ = uVar7;
            auVar105 = vfmadd231ps_fma(auVar341._0_32_,auVar256,pauVar34[4]);
            auVar341 = ZEXT1664(auVar105);
            auVar62 = ZEXT1632(auVar105);
            auVar105 = vfmadd231ps_fma(auVar240._0_32_,auVar313,pauVar34[5]);
            auVar240 = ZEXT1664(auVar105);
            auVar246 = ZEXT1632(auVar105);
            auVar105 = vfmadd231ps_fma(auVar347._0_32_,auVar350,pauVar34[6]);
            auVar347 = ZEXT1664(auVar105);
            auVar91 = ZEXT1632(auVar105);
            auVar105 = vfmadd231ps_fma(auVar305._0_32_,auVar360,pauVar34[7]);
            auVar305 = ZEXT1664(auVar105);
            auVar93 = ZEXT1632(auVar105);
            pauVar30 = pauVar30 + 1;
            pauVar34 = pauVar34 + 8;
            iVar27 = iVar27 + 8;
            uVar43 = uVar46 & 0xfffffff8;
          } while (iVar27 < (int)uVar46);
        }
        auVar248 = auVar373._0_32_;
        auVar180 = auVar197._0_32_;
        auVar160 = auVar161._0_32_;
        uVar41 = uVar43 | 3;
        while (auVar295 = auVar101._0_32_, (int)uVar41 < (int)uVar46) {
          uVar7 = *(undefined4 *)*pauVar30;
          auVar257._4_4_ = uVar7;
          auVar257._0_4_ = uVar7;
          auVar257._8_4_ = uVar7;
          auVar257._12_4_ = uVar7;
          auVar257._16_4_ = uVar7;
          auVar257._20_4_ = uVar7;
          auVar257._24_4_ = uVar7;
          auVar257._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(*pauVar30 + 4);
          auVar314._4_4_ = uVar7;
          auVar314._0_4_ = uVar7;
          auVar314._8_4_ = uVar7;
          auVar314._12_4_ = uVar7;
          auVar314._16_4_ = uVar7;
          auVar314._20_4_ = uVar7;
          auVar314._24_4_ = uVar7;
          auVar314._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(*pauVar30 + 8);
          auVar351._4_4_ = uVar7;
          auVar351._0_4_ = uVar7;
          auVar351._8_4_ = uVar7;
          auVar351._12_4_ = uVar7;
          auVar351._16_4_ = uVar7;
          auVar351._20_4_ = uVar7;
          auVar351._24_4_ = uVar7;
          auVar351._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(*pauVar30 + 0xc);
          auVar361._4_4_ = uVar7;
          auVar361._0_4_ = uVar7;
          auVar361._8_4_ = uVar7;
          auVar361._12_4_ = uVar7;
          auVar361._16_4_ = uVar7;
          auVar361._20_4_ = uVar7;
          auVar361._24_4_ = uVar7;
          auVar361._28_4_ = uVar7;
          auVar105 = vfmadd231ps_fma(auVar295,auVar257,*pauVar34);
          auVar101 = ZEXT1664(auVar105);
          auVar105 = vfmadd231ps_fma(auVar373._0_32_,auVar314,pauVar34[1]);
          auVar373 = ZEXT1664(auVar105);
          auVar248 = ZEXT1632(auVar105);
          auVar105 = vfmadd231ps_fma(auVar197._0_32_,auVar351,pauVar34[2]);
          auVar197 = ZEXT1664(auVar105);
          auVar180 = ZEXT1632(auVar105);
          auVar105 = vfmadd231ps_fma(auVar161._0_32_,auVar361,pauVar34[3]);
          auVar161 = ZEXT1664(auVar105);
          auVar160 = ZEXT1632(auVar105);
          pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
          pauVar34 = pauVar34 + 4;
          uVar41 = uVar43 + 7;
          uVar43 = uVar43 + 4;
        }
        if (uVar46 - uVar43 != 0 && (int)uVar43 <= (int)uVar46) {
          lVar39 = 0;
          do {
            uVar7 = *(undefined4 *)(*pauVar30 + lVar39 * 4);
            auVar258._4_4_ = uVar7;
            auVar258._0_4_ = uVar7;
            auVar258._8_4_ = uVar7;
            auVar258._12_4_ = uVar7;
            auVar258._16_4_ = uVar7;
            auVar258._20_4_ = uVar7;
            auVar258._24_4_ = uVar7;
            auVar258._28_4_ = uVar7;
            auVar105 = vfmadd231ps_fma(auVar101._0_32_,auVar258,*pauVar34);
            auVar101 = ZEXT1664(auVar105);
            auVar295 = ZEXT1632(auVar105);
            pauVar34 = pauVar34 + 1;
            lVar39 = lVar39 + 1;
          } while (uVar46 - uVar43 != (int)lVar39);
        }
        fVar67 = auVar91._0_4_ + auVar93._0_4_ + auVar62._0_4_ + auVar246._0_4_ +
                 auVar248._0_4_ + auVar160._0_4_ + auVar180._0_4_ + auVar295._0_4_;
        fVar102 = auVar91._4_4_ + auVar93._4_4_ + auVar62._4_4_ + auVar246._4_4_ +
                  auVar248._4_4_ + auVar160._4_4_ + auVar180._4_4_ + auVar295._4_4_;
        auVar86._0_8_ = CONCAT44(fVar102,fVar67);
        auVar86._8_4_ =
             auVar91._8_4_ + auVar93._8_4_ + auVar62._8_4_ + auVar246._8_4_ +
             auVar248._8_4_ + auVar160._8_4_ + auVar180._8_4_ + auVar295._8_4_;
        auVar86._12_4_ =
             auVar91._12_4_ + auVar93._12_4_ + auVar62._12_4_ + auVar246._12_4_ +
             auVar248._12_4_ + auVar160._12_4_ + auVar180._12_4_ + auVar295._12_4_;
        auVar86._16_4_ =
             auVar91._16_4_ + auVar93._16_4_ + auVar62._16_4_ + auVar246._16_4_ +
             auVar248._16_4_ + auVar160._16_4_ + auVar180._16_4_ + auVar295._16_4_;
        auVar86._20_4_ =
             auVar91._20_4_ + auVar93._20_4_ + auVar62._20_4_ + auVar246._20_4_ +
             auVar248._20_4_ + auVar160._20_4_ + auVar180._20_4_ + auVar295._20_4_;
        auVar86._24_4_ =
             auVar91._24_4_ + auVar93._24_4_ + auVar62._24_4_ + auVar246._24_4_ +
             auVar248._24_4_ + auVar160._24_4_ + auVar180._24_4_ + auVar295._24_4_;
        auVar86._28_4_ =
             auVar91._28_4_ + auVar93._28_4_ + auVar62._28_4_ + auVar246._28_4_ +
             auVar248._28_4_ + auVar160._28_4_ + auVar180._28_4_ + auVar295._28_4_;
        auVar246 = auVar252._0_32_;
        fVar103 = auVar252._0_4_;
        fVar66 = auVar252._4_4_;
        fVar306 = auVar252._8_4_;
        fVar162 = auVar252._12_4_;
        fVar326 = auVar252._16_4_;
        fVar327 = auVar252._20_4_;
        fVar328 = auVar252._24_4_;
        fVar329 = auVar252._28_4_;
        switch(uVar14) {
        case 1:
          auVar86 = vmaxps_avx(auVar86,_DAT_00557200);
          break;
        case 2:
          auVar246 = vmaxps_avx(auVar86,ZEXT1632(ZEXT816(0) << 0x40));
          auVar93 = vminps_avx(auVar86,ZEXT1632(ZEXT816(0) << 0x40));
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
          auVar90._4_4_ = uVar7;
          auVar90._0_4_ = uVar7;
          auVar90._8_4_ = uVar7;
          auVar90._12_4_ = uVar7;
          auVar90._16_4_ = uVar7;
          auVar90._20_4_ = uVar7;
          auVar90._24_4_ = uVar7;
          auVar90._28_4_ = uVar7;
          auVar105 = vfmadd213ps_fma(auVar90,auVar93,auVar246);
          auVar86 = ZEXT1632(auVar105);
          break;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
          auVar143._4_4_ = uVar7;
          auVar143._0_4_ = uVar7;
          auVar143._8_4_ = uVar7;
          auVar143._12_4_ = uVar7;
          auVar143._16_4_ = uVar7;
          auVar143._20_4_ = uVar7;
          auVar143._24_4_ = uVar7;
          auVar143._28_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var15))[1];
          auVar189._4_4_ = uVar7;
          auVar189._0_4_ = uVar7;
          auVar189._8_4_ = uVar7;
          auVar189._12_4_ = uVar7;
          auVar189._16_4_ = uVar7;
          auVar189._20_4_ = uVar7;
          auVar189._24_4_ = uVar7;
          auVar189._28_4_ = uVar7;
          auVar246 = vmaxps_avx(auVar86,auVar143);
          auVar86 = vminps_avx(auVar246,auVar189);
          break;
        case 4:
          auVar87._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
          auVar87._8_4_ = -auVar86._8_4_;
          auVar87._12_4_ = -auVar86._12_4_;
          auVar87._16_4_ = -auVar86._16_4_;
          auVar87._20_4_ = -auVar86._20_4_;
          auVar87._24_4_ = -auVar86._24_4_;
          auVar87._28_4_ = -auVar86._28_4_;
          auVar144._8_4_ = 0x42b0c0a5;
          auVar144._0_8_ = 0x42b0c0a542b0c0a5;
          auVar144._12_4_ = 0x42b0c0a5;
          auVar144._16_4_ = 0x42b0c0a5;
          auVar144._20_4_ = 0x42b0c0a5;
          auVar144._24_4_ = 0x42b0c0a5;
          auVar144._28_4_ = 0x42b0c0a5;
          auVar93 = vminps_avx(auVar87,auVar144);
          auVar145._8_4_ = 0xc2b0c0a5;
          auVar145._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar145._12_4_ = 0xc2b0c0a5;
          auVar145._16_4_ = 0xc2b0c0a5;
          auVar145._20_4_ = 0xc2b0c0a5;
          auVar145._24_4_ = 0xc2b0c0a5;
          auVar145._28_4_ = 0xc2b0c0a5;
          auVar62 = vmaxps_avx(auVar93,auVar145);
          auVar146._8_4_ = 0x3fb8aa3b;
          auVar146._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar146._12_4_ = 0x3fb8aa3b;
          auVar146._16_4_ = 0x3fb8aa3b;
          auVar146._20_4_ = 0x3fb8aa3b;
          auVar146._24_4_ = 0x3fb8aa3b;
          auVar146._28_4_ = 0x3fb8aa3b;
          auVar105 = vfmadd213ps_fma(auVar146,auVar62,auVar273);
          auVar91 = vroundps_avx(ZEXT1632(auVar105),1);
          auVar93 = vcmpps_avx(ZEXT1632(auVar105),auVar91,1);
          auVar93 = vandps_avx(auVar93,auVar246);
          auVar93 = vsubps_avx(auVar91,auVar93);
          auVar190._8_4_ = 0x3f318000;
          auVar190._0_8_ = 0x3f3180003f318000;
          auVar190._12_4_ = 0x3f318000;
          auVar190._16_4_ = 0x3f318000;
          auVar190._20_4_ = 0x3f318000;
          auVar190._24_4_ = 0x3f318000;
          auVar190._28_4_ = 0x3f318000;
          auVar105 = vfmsub231ps_fma(auVar62,auVar93,auVar190);
          auVar191._8_4_ = 0x395e8083;
          auVar191._0_8_ = 0x395e8083395e8083;
          auVar191._12_4_ = 0x395e8083;
          auVar191._16_4_ = 0x395e8083;
          auVar191._20_4_ = 0x395e8083;
          auVar191._24_4_ = 0x395e8083;
          auVar191._28_4_ = 0x395e8083;
          auVar163 = vfmsub231ps_fma(ZEXT1632(auVar105),auVar93,auVar191);
          auVar62 = ZEXT1632(auVar163);
          auVar22._28_4_ = 0x395e8083;
          auVar22._0_28_ =
               ZEXT1628(CONCAT412(auVar163._12_4_ * auVar163._12_4_,
                                  CONCAT48(auVar163._8_4_ * auVar163._8_4_,
                                           CONCAT44(auVar163._4_4_ * auVar163._4_4_,
                                                    auVar163._0_4_ * auVar163._0_4_))));
          auVar239._8_4_ = 0x39506967;
          auVar239._0_8_ = 0x3950696739506967;
          auVar239._12_4_ = 0x39506967;
          auVar239._16_4_ = 0x39506967;
          auVar239._20_4_ = 0x39506967;
          auVar239._24_4_ = 0x39506967;
          auVar239._28_4_ = 0x39506967;
          auVar262._8_4_ = 0x3ab743ce;
          auVar262._0_8_ = 0x3ab743ce3ab743ce;
          auVar262._12_4_ = 0x3ab743ce;
          auVar262._16_4_ = 0x3ab743ce;
          auVar262._20_4_ = 0x3ab743ce;
          auVar262._24_4_ = 0x3ab743ce;
          auVar262._28_4_ = 0x3ab743ce;
          auVar105 = vfmadd213ps_fma(auVar239,auVar62,auVar262);
          auVar221._8_4_ = 0x3c088908;
          auVar221._0_8_ = 0x3c0889083c088908;
          auVar221._12_4_ = 0x3c088908;
          auVar221._16_4_ = 0x3c088908;
          auVar221._20_4_ = 0x3c088908;
          auVar221._24_4_ = 0x3c088908;
          auVar221._28_4_ = 0x3c088908;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar221);
          auVar222._8_4_ = 0x3d2aa9c1;
          auVar222._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar222._12_4_ = 0x3d2aa9c1;
          auVar222._16_4_ = 0x3d2aa9c1;
          auVar222._20_4_ = 0x3d2aa9c1;
          auVar222._24_4_ = 0x3d2aa9c1;
          auVar222._28_4_ = 0x3d2aa9c1;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar222);
          auVar60._8_4_ = 0x3e2aaaaa;
          auVar60._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar60._12_4_ = 0x3e2aaaaa;
          auVar60._16_4_ = 0x3e2aaaaa;
          auVar60._20_4_ = 0x3e2aaaaa;
          auVar60._24_4_ = 0x3e2aaaaa;
          auVar60._28_4_ = 0x3e2aaaaa;
          auVar62 = ZEXT1632(auVar163);
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar60);
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar273);
          auVar167 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar22,auVar62);
          auVar68._0_4_ = (int)auVar93._0_4_;
          auVar68._4_4_ = (int)auVar93._4_4_;
          auVar68._8_4_ = (int)auVar93._8_4_;
          auVar68._12_4_ = (int)auVar93._12_4_;
          auVar88._16_4_ = (int)auVar93._16_4_;
          auVar88._0_16_ = auVar68;
          auVar88._20_4_ = (int)auVar93._20_4_;
          auVar88._24_4_ = (int)auVar93._24_4_;
          auVar88._28_4_ = (int)auVar93._28_4_;
          auVar163 = vpslld_avx(auVar68,0x17);
          auVar105 = vpslld_avx(auVar88._16_16_,0x17);
          auVar47._8_4_ = 0x3f800000;
          auVar47._0_8_ = 0x3f8000003f800000;
          auVar47._12_4_ = 0x3f800000;
          auVar105 = vpaddd_avx(auVar105,auVar47);
          auVar163 = vpaddd_avx(auVar163,auVar47);
          auVar89._16_16_ = auVar105;
          auVar89._0_16_ = auVar163;
          auVar147._0_4_ = auVar167._0_4_ + fVar103;
          auVar147._4_4_ = auVar167._4_4_ + fVar66;
          auVar147._8_4_ = auVar167._8_4_ + fVar306;
          auVar147._12_4_ = auVar167._12_4_ + fVar162;
          auVar147._16_4_ = fVar326 + 0.0;
          auVar147._20_4_ = fVar327 + 0.0;
          auVar147._24_4_ = fVar328 + 0.0;
          auVar147._28_4_ = fVar329 + 0.0;
          auVar105 = vfmadd213ps_fma(auVar89,auVar147,auVar246);
          auVar93 = vrcpps_avx(ZEXT1632(auVar105));
          auVar105 = vfmsub213ps_fma(ZEXT1632(auVar105),auVar93,auVar246);
          auVar105 = vfnmadd132ps_fma(ZEXT1632(auVar105),auVar93,auVar93);
          auVar86 = ZEXT1632(auVar105);
          break;
        case 5:
          auVar335._8_4_ = 0x42b0c0a5;
          auVar335._0_8_ = 0x42b0c0a542b0c0a5;
          auVar335._12_4_ = 0x42b0c0a5;
          auVar335._16_4_ = 0x42b0c0a5;
          auVar335._20_4_ = 0x42b0c0a5;
          auVar335._24_4_ = 0x42b0c0a5;
          auVar335._28_4_ = 0x42b0c0a5;
          auVar93 = vminps_avx(auVar335,auVar86);
          auVar343._8_4_ = 0xc2b0c0a5;
          auVar343._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar343._12_4_ = 0xc2b0c0a5;
          auVar343._16_4_ = 0xc2b0c0a5;
          auVar343._20_4_ = 0xc2b0c0a5;
          auVar343._24_4_ = 0xc2b0c0a5;
          auVar343._28_4_ = 0xc2b0c0a5;
          auVar62 = vmaxps_avx(auVar343,auVar93);
          auVar181._8_4_ = 0x3fb8aa3b;
          auVar181._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar181._12_4_ = 0x3fb8aa3b;
          auVar181._16_4_ = 0x3fb8aa3b;
          auVar181._20_4_ = 0x3fb8aa3b;
          auVar181._24_4_ = 0x3fb8aa3b;
          auVar181._28_4_ = 0x3fb8aa3b;
          auVar105 = vfmadd213ps_fma(auVar181,auVar62,auVar273);
          auVar91 = vroundps_avx(ZEXT1632(auVar105),1);
          auVar93 = vcmpps_avx(ZEXT1632(auVar105),auVar91,1);
          auVar93 = vandps_avx(auVar93,auVar246);
          auVar93 = vsubps_avx(auVar91,auVar93);
          auVar362._8_4_ = 0x3f318000;
          auVar362._0_8_ = 0x3f3180003f318000;
          auVar362._12_4_ = 0x3f318000;
          auVar362._16_4_ = 0x3f318000;
          auVar362._20_4_ = 0x3f318000;
          auVar362._24_4_ = 0x3f318000;
          auVar362._28_4_ = 0x3f318000;
          auVar105 = vfmsub231ps_fma(auVar62,auVar93,auVar362);
          auVar344._8_4_ = 0xb95e8083;
          auVar344._0_8_ = 0xb95e8083b95e8083;
          auVar344._12_4_ = 0xb95e8083;
          auVar344._16_4_ = 0xb95e8083;
          auVar344._20_4_ = 0xb95e8083;
          auVar344._24_4_ = 0xb95e8083;
          auVar344._28_4_ = 0xb95e8083;
          auVar163 = vfnmsub231ps_fma(ZEXT1632(auVar105),auVar93,auVar344);
          auVar62 = ZEXT1632(auVar163);
          auVar20._28_4_ = auVar91._28_4_;
          auVar20._0_28_ =
               ZEXT1628(CONCAT412(auVar163._12_4_ * auVar163._12_4_,
                                  CONCAT48(auVar163._8_4_ * auVar163._8_4_,
                                           CONCAT44(auVar163._4_4_ * auVar163._4_4_,
                                                    auVar163._0_4_ * auVar163._0_4_))));
          auVar259._8_4_ = 0x39506967;
          auVar259._0_8_ = 0x3950696739506967;
          auVar259._12_4_ = 0x39506967;
          auVar259._16_4_ = 0x39506967;
          auVar259._20_4_ = 0x39506967;
          auVar259._24_4_ = 0x39506967;
          auVar259._28_4_ = 0x39506967;
          auVar370._8_4_ = 0x3ab743ce;
          auVar370._0_8_ = 0x3ab743ce3ab743ce;
          auVar370._12_4_ = 0x3ab743ce;
          auVar370._16_4_ = 0x3ab743ce;
          auVar370._20_4_ = 0x3ab743ce;
          auVar370._24_4_ = 0x3ab743ce;
          auVar370._28_4_ = 0x3ab743ce;
          auVar105 = vfmadd213ps_fma(auVar259,auVar62,auVar370);
          auVar352._8_4_ = 0x3c088908;
          auVar352._0_8_ = 0x3c0889083c088908;
          auVar352._12_4_ = 0x3c088908;
          auVar352._16_4_ = 0x3c088908;
          auVar352._20_4_ = 0x3c088908;
          auVar352._24_4_ = 0x3c088908;
          auVar352._28_4_ = 0x3c088908;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar352);
          auVar247._8_4_ = 0x3d2aa9c1;
          auVar247._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar247._12_4_ = 0x3d2aa9c1;
          auVar247._16_4_ = 0x3d2aa9c1;
          auVar247._20_4_ = 0x3d2aa9c1;
          auVar247._24_4_ = 0x3d2aa9c1;
          auVar247._28_4_ = 0x3d2aa9c1;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar247);
          auVar371._8_4_ = 0x3e2aaaaa;
          auVar371._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar371._12_4_ = 0x3e2aaaaa;
          auVar371._16_4_ = 0x3e2aaaaa;
          auVar371._20_4_ = 0x3e2aaaaa;
          auVar371._24_4_ = 0x3e2aaaaa;
          auVar371._28_4_ = 0x3e2aaaaa;
          auVar62 = ZEXT1632(auVar163);
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar371);
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar273);
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar20,auVar62);
          auVar236._0_4_ = auVar105._0_4_ + fVar103;
          auVar236._4_4_ = auVar105._4_4_ + fVar66;
          auVar236._8_4_ = auVar105._8_4_ + fVar306;
          auVar236._12_4_ = auVar105._12_4_ + fVar162;
          auVar236._16_4_ = fVar326 + 0.0;
          auVar236._20_4_ = fVar327 + 0.0;
          auVar236._24_4_ = fVar328 + 0.0;
          auVar236._28_4_ = fVar329 + 0.0;
          auVar104._0_4_ = (int)auVar93._0_4_;
          auVar104._4_4_ = (int)auVar93._4_4_;
          auVar104._8_4_ = (int)auVar93._8_4_;
          auVar104._12_4_ = (int)auVar93._12_4_;
          auVar139._16_4_ = (int)auVar93._16_4_;
          auVar139._0_16_ = auVar104;
          auVar139._20_4_ = (int)auVar93._20_4_;
          auVar139._24_4_ = (int)auVar93._24_4_;
          auVar139._28_4_ = (int)auVar93._28_4_;
          auVar163 = vpslld_avx(auVar104,0x17);
          auVar105 = vpslld_avx(auVar139._16_16_,0x17);
          auVar198._8_4_ = 0x3f800000;
          auVar198._0_8_ = 0x3f8000003f800000;
          auVar198._12_4_ = 0x3f800000;
          auVar105 = vpaddd_avx(auVar105,auVar198);
          auVar163 = vpaddd_avx(auVar163,auVar198);
          auVar140._16_16_ = auVar105;
          auVar140._0_16_ = auVar163;
          auVar167 = vfmadd213ps_fma(auVar140,auVar236,auVar246);
          auVar182._8_4_ = 0x800000;
          auVar182._0_8_ = 0x80000000800000;
          auVar182._12_4_ = 0x800000;
          auVar182._16_4_ = 0x800000;
          auVar182._20_4_ = 0x800000;
          auVar182._24_4_ = 0x800000;
          auVar182._28_4_ = 0x800000;
          auVar93 = vmaxps_avx(ZEXT1632(auVar167),auVar182);
          auVar163 = vpsrld_avx(auVar93._0_16_,0x17);
          auVar105 = vpsrld_avx(auVar93._16_16_,0x17);
          auVar288._8_4_ = 0x807fffff;
          auVar288._0_8_ = 0x807fffff807fffff;
          auVar288._12_4_ = 0x807fffff;
          auVar288._16_4_ = 0x807fffff;
          auVar288._20_4_ = 0x807fffff;
          auVar288._24_4_ = 0x807fffff;
          auVar288._28_4_ = 0x807fffff;
          auVar93 = vandps_avx(auVar288,auVar93);
          auVar91 = vorps_avx(auVar273,auVar93);
          auVar289._8_4_ = 0x3f3504f3;
          auVar289._0_8_ = 0x3f3504f33f3504f3;
          auVar289._12_4_ = 0x3f3504f3;
          auVar289._16_4_ = 0x3f3504f3;
          auVar289._20_4_ = 0x3f3504f3;
          auVar289._24_4_ = 0x3f3504f3;
          auVar289._28_4_ = 0x3f3504f3;
          auVar62 = vcmpps_avx(auVar289,auVar91,2);
          auVar93 = vandnps_avx(auVar62,auVar91);
          auVar336._8_4_ = 0xbf800000;
          auVar336._0_8_ = 0xbf800000bf800000;
          auVar336._12_4_ = 0xbf800000;
          auVar336._16_4_ = 0xbf800000;
          auVar336._20_4_ = 0xbf800000;
          auVar336._24_4_ = 0xbf800000;
          auVar336._28_4_ = 0xbf800000;
          auVar183._0_4_ = auVar93._0_4_ + auVar91._0_4_ + -1.0;
          auVar183._4_4_ = auVar93._4_4_ + auVar91._4_4_ + -1.0;
          auVar183._8_4_ = auVar93._8_4_ + auVar91._8_4_ + -1.0;
          auVar183._12_4_ = auVar93._12_4_ + auVar91._12_4_ + -1.0;
          auVar183._16_4_ = auVar93._16_4_ + auVar91._16_4_ + -1.0;
          auVar183._20_4_ = auVar93._20_4_ + auVar91._20_4_ + -1.0;
          auVar183._24_4_ = auVar93._24_4_ + auVar91._24_4_ + -1.0;
          auVar183._28_4_ = auVar93._28_4_ + auVar91._28_4_ + -1.0;
          auVar105 = vpsubd_avx(auVar105,auVar62._16_16_);
          auVar307._8_4_ = 0xffffff81;
          auVar307._0_8_ = 0xffffff81ffffff81;
          auVar307._12_4_ = 0xffffff81;
          auVar105 = vpaddd_avx(auVar307,auVar105);
          auVar163 = vpsubd_avx(auVar163,auVar62._0_16_);
          auVar163 = vpaddd_avx(auVar307,auVar163);
          auVar237._16_16_ = auVar105;
          auVar237._0_16_ = auVar163;
          auVar260._0_4_ = auVar183._0_4_ * auVar183._0_4_;
          auVar260._4_4_ = auVar183._4_4_ * auVar183._4_4_;
          auVar260._8_4_ = auVar183._8_4_ * auVar183._8_4_;
          auVar260._12_4_ = auVar183._12_4_ * auVar183._12_4_;
          auVar260._16_4_ = auVar183._16_4_ * auVar183._16_4_;
          auVar260._20_4_ = auVar183._20_4_ * auVar183._20_4_;
          auVar260._24_4_ = auVar183._24_4_ * auVar183._24_4_;
          auVar260._28_4_ = 0;
          auVar290._8_4_ = 0x3d9021bb;
          auVar290._0_8_ = 0x3d9021bb3d9021bb;
          auVar290._12_4_ = 0x3d9021bb;
          auVar290._16_4_ = 0x3d9021bb;
          auVar290._20_4_ = 0x3d9021bb;
          auVar290._24_4_ = 0x3d9021bb;
          auVar290._28_4_ = 0x3d9021bb;
          auVar315._8_4_ = 0xbdebd1b8;
          auVar315._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar315._12_4_ = 0xbdebd1b8;
          auVar315._16_4_ = 0xbdebd1b8;
          auVar315._20_4_ = 0xbdebd1b8;
          auVar315._24_4_ = 0xbdebd1b8;
          auVar315._28_4_ = 0xbdebd1b8;
          auVar105 = vfmadd213ps_fma(auVar290,auVar183,auVar315);
          auVar316._8_4_ = 0x3def251a;
          auVar316._0_8_ = 0x3def251a3def251a;
          auVar316._12_4_ = 0x3def251a;
          auVar316._16_4_ = 0x3def251a;
          auVar316._20_4_ = 0x3def251a;
          auVar316._24_4_ = 0x3def251a;
          auVar316._28_4_ = 0x3def251a;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar183,auVar316);
          auVar317._8_4_ = 0xbdfe5d4f;
          auVar317._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar317._12_4_ = 0xbdfe5d4f;
          auVar317._16_4_ = 0xbdfe5d4f;
          auVar317._20_4_ = 0xbdfe5d4f;
          auVar317._24_4_ = 0xbdfe5d4f;
          auVar317._28_4_ = 0xbdfe5d4f;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar183,auVar317);
          auVar318._8_4_ = 0x3e11e9bf;
          auVar318._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar318._12_4_ = 0x3e11e9bf;
          auVar318._16_4_ = 0x3e11e9bf;
          auVar318._20_4_ = 0x3e11e9bf;
          auVar318._24_4_ = 0x3e11e9bf;
          auVar318._28_4_ = 0x3e11e9bf;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar183,auVar318);
          auVar319._8_4_ = 0xbe2aae50;
          auVar319._0_8_ = 0xbe2aae50be2aae50;
          auVar319._12_4_ = 0xbe2aae50;
          auVar319._16_4_ = 0xbe2aae50;
          auVar319._20_4_ = 0xbe2aae50;
          auVar319._24_4_ = 0xbe2aae50;
          auVar319._28_4_ = 0xbe2aae50;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar183,auVar319);
          auVar320._8_4_ = 0x3e4cceac;
          auVar320._0_8_ = 0x3e4cceac3e4cceac;
          auVar320._12_4_ = 0x3e4cceac;
          auVar320._16_4_ = 0x3e4cceac;
          auVar320._20_4_ = 0x3e4cceac;
          auVar320._24_4_ = 0x3e4cceac;
          auVar320._28_4_ = 0x3e4cceac;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar183,auVar320);
          auVar321._8_4_ = 0xbe7ffffc;
          auVar321._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar321._12_4_ = 0xbe7ffffc;
          auVar321._16_4_ = 0xbe7ffffc;
          auVar321._20_4_ = 0xbe7ffffc;
          auVar321._24_4_ = 0xbe7ffffc;
          auVar321._28_4_ = 0xbe7ffffc;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar183,auVar321);
          auVar322._8_4_ = 0x3eaaaaaa;
          auVar322._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar322._12_4_ = 0x3eaaaaaa;
          auVar322._16_4_ = 0x3eaaaaaa;
          auVar322._20_4_ = 0x3eaaaaaa;
          auVar322._24_4_ = 0x3eaaaaaa;
          auVar322._28_4_ = 0x3eaaaaaa;
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar183,auVar322);
          auVar291._0_4_ = auVar260._0_4_ * auVar183._0_4_ * auVar105._0_4_;
          auVar291._4_4_ = auVar260._4_4_ * auVar183._4_4_ * auVar105._4_4_;
          auVar291._8_4_ = auVar260._8_4_ * auVar183._8_4_ * auVar105._8_4_;
          auVar291._12_4_ = auVar260._12_4_ * auVar183._12_4_ * auVar105._12_4_;
          auVar291._16_4_ = auVar260._16_4_ * auVar183._16_4_ * 0.0;
          auVar291._20_4_ = auVar260._20_4_ * auVar183._20_4_ * 0.0;
          auVar291._24_4_ = auVar260._24_4_ * auVar183._24_4_ * 0.0;
          auVar291._28_4_ = 0;
          auVar62 = vcvtdq2ps_avx(auVar237);
          auVar105 = vfmadd231ps_fma(auVar291,auVar62,auVar344);
          auVar105 = vfmsub231ps_fma(ZEXT1632(auVar105),auVar273,auVar260);
          auVar93 = vcmpps_avx(ZEXT1632(auVar167),_DAT_00557200,2);
          auVar91 = vsubps_avx(ZEXT1632(auVar105),auVar183);
          auVar105 = vfmsub231ps_fma(auVar91,auVar362,auVar62);
          auVar292._8_4_ = 0xc0000000;
          auVar292._0_8_ = 0xc0000000c0000000;
          auVar292._12_4_ = 0xc0000000;
          auVar292._16_4_ = 0xc0000000;
          auVar292._20_4_ = 0xc0000000;
          auVar292._24_4_ = 0xc0000000;
          auVar292._28_4_ = 0xc0000000;
          auVar184._0_4_ = auVar105._0_4_ * -2.0;
          auVar184._4_4_ = auVar105._4_4_ * -2.0;
          auVar184._8_4_ = auVar105._8_4_ * -2.0;
          auVar184._12_4_ = auVar105._12_4_ * -2.0;
          auVar184._16_4_ = 0x80000000;
          auVar184._20_4_ = 0x80000000;
          auVar184._24_4_ = 0x80000000;
          auVar184._28_4_ = 0;
          auVar238._8_4_ = 0x7fffffff;
          auVar238._0_8_ = 0x7fffffff7fffffff;
          auVar238._12_4_ = 0x7fffffff;
          auVar238._16_4_ = 0x7fffffff;
          auVar238._20_4_ = 0x7fffffff;
          auVar238._24_4_ = 0x7fffffff;
          auVar238._28_4_ = 0x7fffffff;
          auVar93 = vblendvps_avx(auVar184,auVar238,auVar93);
          auVar185._8_4_ = 0x42b0c0a5;
          auVar185._0_8_ = 0x42b0c0a542b0c0a5;
          auVar185._12_4_ = 0x42b0c0a5;
          auVar185._16_4_ = 0x42b0c0a5;
          auVar185._20_4_ = 0x42b0c0a5;
          auVar185._24_4_ = 0x42b0c0a5;
          auVar185._28_4_ = 0x42b0c0a5;
          auVar93 = vminps_avx(auVar93,auVar185);
          auVar186._8_4_ = 0xc2b0c0a5;
          auVar186._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar186._12_4_ = 0xc2b0c0a5;
          auVar186._16_4_ = 0xc2b0c0a5;
          auVar186._20_4_ = 0xc2b0c0a5;
          auVar186._24_4_ = 0xc2b0c0a5;
          auVar186._28_4_ = 0xc2b0c0a5;
          auVar62 = vmaxps_avx(auVar93,auVar186);
          auVar187._8_4_ = 0x3fb8aa3b;
          auVar187._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar187._12_4_ = 0x3fb8aa3b;
          auVar187._16_4_ = 0x3fb8aa3b;
          auVar187._20_4_ = 0x3fb8aa3b;
          auVar187._24_4_ = 0x3fb8aa3b;
          auVar187._28_4_ = 0x3fb8aa3b;
          auVar105 = vfmadd213ps_fma(auVar187,auVar62,auVar273);
          auVar91 = vroundps_avx(ZEXT1632(auVar105),1);
          auVar93 = vcmpps_avx(ZEXT1632(auVar105),auVar91,1);
          auVar93 = vandps_avx(auVar93,auVar246);
          auVar93 = vsubps_avx(auVar91,auVar93);
          auVar105 = vfmsub231ps_fma(auVar62,auVar93,auVar362);
          auVar163 = vfnmsub231ps_fma(ZEXT1632(auVar105),auVar93,auVar344);
          auVar62 = ZEXT1632(auVar163);
          auVar21._28_4_ = auVar91._28_4_;
          auVar21._0_28_ =
               ZEXT1628(CONCAT412(auVar163._12_4_ * auVar163._12_4_,
                                  CONCAT48(auVar163._8_4_ * auVar163._8_4_,
                                           CONCAT44(auVar163._4_4_ * auVar163._4_4_,
                                                    auVar163._0_4_ * auVar163._0_4_))));
          auVar261._8_4_ = 0x39506967;
          auVar261._0_8_ = 0x3950696739506967;
          auVar261._12_4_ = 0x39506967;
          auVar261._16_4_ = 0x39506967;
          auVar261._20_4_ = 0x39506967;
          auVar261._24_4_ = 0x39506967;
          auVar261._28_4_ = 0x39506967;
          auVar323._8_4_ = 0x3ab743ce;
          auVar323._0_8_ = 0x3ab743ce3ab743ce;
          auVar323._12_4_ = 0x3ab743ce;
          auVar323._16_4_ = 0x3ab743ce;
          auVar323._20_4_ = 0x3ab743ce;
          auVar323._24_4_ = 0x3ab743ce;
          auVar323._28_4_ = 0x3ab743ce;
          auVar105 = vfmadd213ps_fma(auVar261,auVar62,auVar323);
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar352);
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar247);
          auVar252 = ZEXT3264(auVar246);
          auVar62 = ZEXT1632(auVar163);
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar371);
          auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar62,auVar273);
          auVar167 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar21,auVar62);
          auVar106._0_4_ = (int)auVar93._0_4_;
          auVar106._4_4_ = (int)auVar93._4_4_;
          auVar106._8_4_ = (int)auVar93._8_4_;
          auVar106._12_4_ = (int)auVar93._12_4_;
          auVar141._16_4_ = (int)auVar93._16_4_;
          auVar141._0_16_ = auVar106;
          auVar141._20_4_ = (int)auVar93._20_4_;
          auVar141._24_4_ = (int)auVar93._24_4_;
          auVar141._28_4_ = (int)auVar93._28_4_;
          auVar163 = vpslld_avx(auVar106,0x17);
          auVar105 = vpslld_avx(auVar141._16_16_,0x17);
          auVar105 = vpaddd_avx(auVar105,auVar198);
          auVar163 = vpaddd_avx(auVar163,auVar198);
          auVar142._16_16_ = auVar105;
          auVar142._0_16_ = auVar163;
          auVar188._0_4_ = auVar167._0_4_ + fVar103;
          auVar188._4_4_ = auVar167._4_4_ + fVar66;
          auVar188._8_4_ = auVar167._8_4_ + fVar306;
          auVar188._12_4_ = auVar167._12_4_ + fVar162;
          auVar188._16_4_ = fVar326 + 0.0;
          auVar188._20_4_ = fVar327 + 0.0;
          auVar188._24_4_ = fVar328 + 0.0;
          auVar188._28_4_ = fVar329 + 0.0;
          auVar105 = vfmadd213ps_fma(auVar142,auVar188,auVar246);
          auVar93 = vrcpps_avx(ZEXT1632(auVar105));
          auVar105 = vfmsub213ps_fma(ZEXT1632(auVar105),auVar93,auVar246);
          auVar105 = vfnmadd132ps_fma(ZEXT1632(auVar105),auVar93,auVar93);
          auVar105 = vfnmadd213ps_fma(ZEXT1632(auVar105),auVar292,auVar336);
          auVar138 = ZEXT1628(auVar105);
          goto LAB_002cdbcf;
        case 6:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var15);
          auVar148._4_4_ = uVar7;
          auVar148._0_4_ = uVar7;
          auVar148._8_4_ = uVar7;
          auVar148._12_4_ = uVar7;
          auVar148._16_4_ = uVar7;
          auVar148._20_4_ = uVar7;
          auVar148._24_4_ = uVar7;
          auVar148._28_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var15))[1];
          auVar192._4_4_ = uVar7;
          auVar192._0_4_ = uVar7;
          auVar192._8_4_ = uVar7;
          auVar192._12_4_ = uVar7;
          auVar192._16_4_ = uVar7;
          auVar192._20_4_ = uVar7;
          auVar192._24_4_ = uVar7;
          auVar192._28_4_ = uVar7;
          auVar105 = vfmadd231ps_fma(auVar192,auVar86,auVar148);
          auVar93 = vmaxps_avx(ZEXT1632(auVar105),_DAT_00557200);
          auVar246 = vminps_avx(auVar93,auVar246);
          auVar138 = auVar246._0_28_;
LAB_002cdbcf:
          auVar86._4_4_ = auVar138._4_4_ * fVar102;
          auVar86._0_4_ = auVar138._0_4_ * fVar67;
          auVar86._8_4_ = auVar138._8_4_ * auVar86._8_4_;
          auVar86._12_4_ = auVar138._12_4_ * auVar86._12_4_;
          auVar86._16_4_ = auVar138._16_4_ * auVar86._16_4_;
          auVar86._20_4_ = auVar138._20_4_ * auVar86._20_4_;
          auVar86._24_4_ = auVar138._24_4_ * auVar86._24_4_;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar29 * 0x20) = auVar86;
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar28);
    }
    iVar27 = 0;
  }
LAB_002cf3fb:
  if ((int *)local_f8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_f8._8_8_ == 0) {
      if (local_d8 == (Allocator *)0x0) {
        if ((void *)local_f8._0_8_ != (void *)0x0) {
          free((void *)local_f8._0_8_);
        }
      }
      else {
        (*local_d8->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int InnerProduct_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}